

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiIntersectorK<8,4>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx512::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined1 auVar1 [16];
  Geometry *pGVar2;
  RTCFilterFunctionN p_Var3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  int iVar15;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [12];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  byte bVar62;
  byte bVar63;
  byte bVar64;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  byte bVar65;
  ulong uVar66;
  byte bVar67;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  ulong uVar68;
  undefined8 unaff_R13;
  bool bVar69;
  ulong uVar70;
  uint uVar71;
  uint uVar131;
  uint uVar132;
  uint uVar134;
  uint uVar135;
  uint uVar136;
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  uint uVar133;
  uint uVar137;
  undefined1 auVar124 [32];
  undefined1 auVar80 [16];
  undefined1 auVar125 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar130 [32];
  float pp;
  float fVar138;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined4 uVar155;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar166 [16];
  undefined1 auVar171 [32];
  float fVar172;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  float fVar192;
  float fVar193;
  float fVar209;
  float fVar210;
  float fVar211;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar212;
  float fVar213;
  undefined1 auVar208 [32];
  float fVar214;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar223 [32];
  undefined1 auVar222 [16];
  undefined1 auVar224 [32];
  undefined1 auVar225 [64];
  float fVar228;
  undefined1 auVar226 [16];
  float fVar229;
  float fVar230;
  float fVar231;
  undefined1 auVar227 [32];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [32];
  undefined1 auVar235 [64];
  float fVar236;
  float fVar243;
  undefined1 auVar239 [32];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  float fVar241;
  float fVar242;
  undefined1 auVar240 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  float s;
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [64];
  undefined1 auVar255 [64];
  undefined1 auVar256 [64];
  undefined1 auVar257 [64];
  undefined1 auVar258 [64];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  StackEntry stack [3];
  int local_a2c;
  undefined1 local_8d0 [16];
  ulong local_8b8;
  uint local_8b0;
  uint local_8ac;
  float local_8a8;
  float local_8a4;
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  Primitive *local_7a0;
  ulong local_798;
  RTCFilterFunctionNArguments local_790;
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [16];
  undefined1 local_710 [16];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_650 [16];
  undefined1 local_640 [16];
  float local_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [16];
  ulong local_608;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  undefined1 local_570 [16];
  undefined1 local_560 [16];
  undefined1 local_550 [16];
  RTCHitN local_540 [16];
  undefined1 auStack_530 [16];
  undefined4 local_520;
  undefined4 uStack_51c;
  undefined4 uStack_518;
  undefined4 uStack_514;
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined1 local_4e0 [16];
  uint local_4d0;
  uint uStack_4cc;
  uint uStack_4c8;
  uint uStack_4c4;
  uint uStack_4c0;
  uint uStack_4bc;
  uint uStack_4b8;
  uint uStack_4b4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  byte abStack_180 [32];
  uint auStack_160 [8];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar126 [32];
  undefined1 auVar129 [32];
  
  uVar70 = (ulong)(byte)prim[1];
  fVar214 = *(float *)(prim + uVar70 * 0x19 + 0x12);
  auVar74 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar74 = vinsertps_avx(auVar74,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar75 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar11 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar220 = vsubps_avx(auVar74,*(undefined1 (*) [16])(prim + uVar70 * 0x19 + 6));
  fVar192 = fVar214 * auVar220._0_4_;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar70 * 4 + 6);
  auVar86 = vpmovsxbd_avx2(auVar74);
  fVar138 = fVar214 * auVar11._0_4_;
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar70 * 5 + 6);
  auVar84 = vpmovsxbd_avx2(auVar75);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar70 * 6 + 6);
  auVar87 = vpmovsxbd_avx2(auVar72);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(ulong *)(prim + uVar70 * 0xb + 6);
  auVar88 = vpmovsxbd_avx2(auVar1);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar70 * 0xc + 6);
  auVar89 = vpmovsxbd_avx2(auVar76);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar70 * 0xd + 6);
  auVar85 = vpmovsxbd_avx2(auVar73);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar70 * 0x12 + 6);
  auVar90 = vpmovsxbd_avx2(auVar77);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar70 * 0x13 + 6);
  auVar91 = vpmovsxbd_avx2(auVar78);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar70 * 0x14 + 6);
  auVar93 = vpmovsxbd_avx2(auVar79);
  auVar92 = vcvtdq2ps_avx(auVar93);
  auVar104._8_4_ = 1;
  auVar104._0_8_ = 0x100000001;
  auVar104._12_4_ = 1;
  auVar104._16_4_ = 1;
  auVar104._20_4_ = 1;
  auVar104._24_4_ = 1;
  auVar104._28_4_ = 1;
  auVar102._4_4_ = fVar138;
  auVar102._0_4_ = fVar138;
  auVar102._8_4_ = fVar138;
  auVar102._12_4_ = fVar138;
  auVar102._16_4_ = fVar138;
  auVar102._20_4_ = fVar138;
  auVar102._24_4_ = fVar138;
  auVar102._28_4_ = fVar138;
  auVar83 = ZEXT1632(CONCAT412(fVar214 * auVar11._12_4_,
                               CONCAT48(fVar214 * auVar11._8_4_,
                                        CONCAT44(fVar214 * auVar11._4_4_,fVar138))));
  auVar94 = vpermps_avx2(auVar104,auVar83);
  auVar81 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar82 = vpermps_avx512vl(auVar81,auVar83);
  fVar138 = auVar82._0_4_;
  auVar225._0_4_ = fVar138 * auVar87._0_4_;
  fVar193 = auVar82._4_4_;
  auVar225._4_4_ = fVar193 * auVar87._4_4_;
  fVar209 = auVar82._8_4_;
  auVar225._8_4_ = fVar209 * auVar87._8_4_;
  fVar210 = auVar82._12_4_;
  auVar225._12_4_ = fVar210 * auVar87._12_4_;
  fVar211 = auVar82._16_4_;
  auVar225._16_4_ = fVar211 * auVar87._16_4_;
  fVar212 = auVar82._20_4_;
  auVar225._20_4_ = fVar212 * auVar87._20_4_;
  fVar213 = auVar82._24_4_;
  auVar225._28_36_ = in_ZMM4._28_36_;
  auVar225._24_4_ = fVar213 * auVar87._24_4_;
  auVar83._4_4_ = auVar85._4_4_ * fVar193;
  auVar83._0_4_ = auVar85._0_4_ * fVar138;
  auVar83._8_4_ = auVar85._8_4_ * fVar209;
  auVar83._12_4_ = auVar85._12_4_ * fVar210;
  auVar83._16_4_ = auVar85._16_4_ * fVar211;
  auVar83._20_4_ = auVar85._20_4_ * fVar212;
  auVar83._24_4_ = auVar85._24_4_ * fVar213;
  auVar83._28_4_ = auVar93._28_4_;
  auVar93._4_4_ = fVar193 * auVar92._4_4_;
  auVar93._0_4_ = fVar138 * auVar92._0_4_;
  auVar93._8_4_ = fVar209 * auVar92._8_4_;
  auVar93._12_4_ = fVar210 * auVar92._12_4_;
  auVar93._16_4_ = fVar211 * auVar92._16_4_;
  auVar93._20_4_ = fVar212 * auVar92._20_4_;
  auVar93._24_4_ = fVar213 * auVar92._24_4_;
  auVar93._28_4_ = auVar82._28_4_;
  auVar74 = vfmadd231ps_fma(auVar225._0_32_,auVar94,auVar84);
  auVar75 = vfmadd231ps_fma(auVar83,auVar94,auVar89);
  auVar72 = vfmadd231ps_fma(auVar93,auVar91,auVar94);
  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar102,auVar86);
  auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar102,auVar88);
  auVar72 = vfmadd231ps_fma(ZEXT1632(auVar72),auVar90,auVar102);
  auVar103._4_4_ = fVar192;
  auVar103._0_4_ = fVar192;
  auVar103._8_4_ = fVar192;
  auVar103._12_4_ = fVar192;
  auVar103._16_4_ = fVar192;
  auVar103._20_4_ = fVar192;
  auVar103._24_4_ = fVar192;
  auVar103._28_4_ = fVar192;
  auVar94 = ZEXT1632(CONCAT412(fVar214 * auVar220._12_4_,
                               CONCAT48(fVar214 * auVar220._8_4_,
                                        CONCAT44(fVar214 * auVar220._4_4_,fVar192))));
  auVar93 = vpermps_avx2(auVar104,auVar94);
  auVar83 = vpermps_avx512vl(auVar81,auVar94);
  fVar214 = auVar83._0_4_;
  fVar138 = auVar83._4_4_;
  auVar94._4_4_ = fVar138 * auVar87._4_4_;
  auVar94._0_4_ = fVar214 * auVar87._0_4_;
  fVar193 = auVar83._8_4_;
  auVar94._8_4_ = fVar193 * auVar87._8_4_;
  fVar209 = auVar83._12_4_;
  auVar94._12_4_ = fVar209 * auVar87._12_4_;
  fVar210 = auVar83._16_4_;
  auVar94._16_4_ = fVar210 * auVar87._16_4_;
  fVar211 = auVar83._20_4_;
  auVar94._20_4_ = fVar211 * auVar87._20_4_;
  fVar212 = auVar83._24_4_;
  auVar94._24_4_ = fVar212 * auVar87._24_4_;
  auVar94._28_4_ = auVar87._28_4_;
  auVar97._0_4_ = fVar214 * auVar85._0_4_;
  auVar97._4_4_ = fVar138 * auVar85._4_4_;
  auVar97._8_4_ = fVar193 * auVar85._8_4_;
  auVar97._12_4_ = fVar209 * auVar85._12_4_;
  auVar97._16_4_ = fVar210 * auVar85._16_4_;
  auVar97._20_4_ = fVar211 * auVar85._20_4_;
  auVar97._24_4_ = fVar212 * auVar85._24_4_;
  auVar97._28_4_ = 0;
  auVar85._4_4_ = fVar138 * auVar92._4_4_;
  auVar85._0_4_ = fVar214 * auVar92._0_4_;
  auVar85._8_4_ = fVar193 * auVar92._8_4_;
  auVar85._12_4_ = fVar209 * auVar92._12_4_;
  auVar85._16_4_ = fVar210 * auVar92._16_4_;
  auVar85._20_4_ = fVar211 * auVar92._20_4_;
  auVar85._24_4_ = fVar212 * auVar92._24_4_;
  auVar85._28_4_ = auVar92._28_4_;
  auVar1 = vfmadd231ps_fma(auVar94,auVar93,auVar84);
  auVar76 = vfmadd231ps_fma(auVar97,auVar93,auVar89);
  auVar73 = vfmadd231ps_fma(auVar85,auVar93,auVar91);
  auVar1 = vfmadd231ps_fma(ZEXT1632(auVar1),auVar103,auVar86);
  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar103,auVar88);
  auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),auVar103,auVar90);
  auVar99._8_4_ = 0x7fffffff;
  auVar99._0_8_ = 0x7fffffff7fffffff;
  auVar99._12_4_ = 0x7fffffff;
  auVar99._16_4_ = 0x7fffffff;
  auVar99._20_4_ = 0x7fffffff;
  auVar99._24_4_ = 0x7fffffff;
  auVar99._28_4_ = 0x7fffffff;
  auVar101._8_4_ = 0x219392ef;
  auVar101._0_8_ = 0x219392ef219392ef;
  auVar101._12_4_ = 0x219392ef;
  auVar101._16_4_ = 0x219392ef;
  auVar101._20_4_ = 0x219392ef;
  auVar101._24_4_ = 0x219392ef;
  auVar101._28_4_ = 0x219392ef;
  auVar86 = vandps_avx(ZEXT1632(auVar74),auVar99);
  uVar66 = vcmpps_avx512vl(auVar86,auVar101,1);
  bVar69 = (bool)((byte)uVar66 & 1);
  auVar81._0_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar74._0_4_;
  bVar69 = (bool)((byte)(uVar66 >> 1) & 1);
  auVar81._4_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar74._4_4_;
  bVar69 = (bool)((byte)(uVar66 >> 2) & 1);
  auVar81._8_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar74._8_4_;
  bVar69 = (bool)((byte)(uVar66 >> 3) & 1);
  auVar81._12_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar74._12_4_;
  auVar81._16_4_ = (uint)((byte)(uVar66 >> 4) & 1) * 0x219392ef;
  auVar81._20_4_ = (uint)((byte)(uVar66 >> 5) & 1) * 0x219392ef;
  auVar81._24_4_ = (uint)((byte)(uVar66 >> 6) & 1) * 0x219392ef;
  auVar81._28_4_ = (uint)(byte)(uVar66 >> 7) * 0x219392ef;
  auVar86 = vandps_avx(ZEXT1632(auVar75),auVar99);
  uVar66 = vcmpps_avx512vl(auVar86,auVar101,1);
  bVar69 = (bool)((byte)uVar66 & 1);
  auVar82._0_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar75._0_4_;
  bVar69 = (bool)((byte)(uVar66 >> 1) & 1);
  auVar82._4_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar75._4_4_;
  bVar69 = (bool)((byte)(uVar66 >> 2) & 1);
  auVar82._8_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar75._8_4_;
  bVar69 = (bool)((byte)(uVar66 >> 3) & 1);
  auVar82._12_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar75._12_4_;
  auVar82._16_4_ = (uint)((byte)(uVar66 >> 4) & 1) * 0x219392ef;
  auVar82._20_4_ = (uint)((byte)(uVar66 >> 5) & 1) * 0x219392ef;
  auVar82._24_4_ = (uint)((byte)(uVar66 >> 6) & 1) * 0x219392ef;
  auVar82._28_4_ = (uint)(byte)(uVar66 >> 7) * 0x219392ef;
  auVar86 = vandps_avx(ZEXT1632(auVar72),auVar99);
  uVar66 = vcmpps_avx512vl(auVar86,auVar101,1);
  bVar69 = (bool)((byte)uVar66 & 1);
  auVar86._0_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar72._0_4_;
  bVar69 = (bool)((byte)(uVar66 >> 1) & 1);
  auVar86._4_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar72._4_4_;
  bVar69 = (bool)((byte)(uVar66 >> 2) & 1);
  auVar86._8_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar72._8_4_;
  bVar69 = (bool)((byte)(uVar66 >> 3) & 1);
  auVar86._12_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar72._12_4_;
  auVar86._16_4_ = (uint)((byte)(uVar66 >> 4) & 1) * 0x219392ef;
  auVar86._20_4_ = (uint)((byte)(uVar66 >> 5) & 1) * 0x219392ef;
  auVar86._24_4_ = (uint)((byte)(uVar66 >> 6) & 1) * 0x219392ef;
  auVar86._28_4_ = (uint)(byte)(uVar66 >> 7) * 0x219392ef;
  auVar84 = vrcp14ps_avx512vl(auVar81);
  auVar100._8_4_ = 0x3f800000;
  auVar100._0_8_ = 0x3f8000003f800000;
  auVar100._12_4_ = 0x3f800000;
  auVar100._16_4_ = 0x3f800000;
  auVar100._20_4_ = 0x3f800000;
  auVar100._24_4_ = 0x3f800000;
  auVar100._28_4_ = 0x3f800000;
  auVar74 = vfnmadd213ps_fma(auVar81,auVar84,auVar100);
  auVar74 = vfmadd132ps_fma(ZEXT1632(auVar74),auVar84,auVar84);
  auVar84 = vrcp14ps_avx512vl(auVar82);
  auVar75 = vfnmadd213ps_fma(auVar82,auVar84,auVar100);
  auVar75 = vfmadd132ps_fma(ZEXT1632(auVar75),auVar84,auVar84);
  auVar84 = vrcp14ps_avx512vl(auVar86);
  auVar72 = vfnmadd213ps_fma(auVar86,auVar84,auVar100);
  auVar72 = vfmadd132ps_fma(ZEXT1632(auVar72),auVar84,auVar84);
  auVar86 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 7 + 6));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,ZEXT1632(auVar1));
  auVar90._4_4_ = auVar74._4_4_ * auVar86._4_4_;
  auVar90._0_4_ = auVar74._0_4_ * auVar86._0_4_;
  auVar90._8_4_ = auVar74._8_4_ * auVar86._8_4_;
  auVar90._12_4_ = auVar74._12_4_ * auVar86._12_4_;
  auVar90._16_4_ = auVar86._16_4_ * 0.0;
  auVar90._20_4_ = auVar86._20_4_ * 0.0;
  auVar90._24_4_ = auVar86._24_4_ * 0.0;
  auVar90._28_4_ = auVar86._28_4_;
  auVar86 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 9 + 6));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,ZEXT1632(auVar1));
  auVar98._0_4_ = auVar74._0_4_ * auVar86._0_4_;
  auVar98._4_4_ = auVar74._4_4_ * auVar86._4_4_;
  auVar98._8_4_ = auVar74._8_4_ * auVar86._8_4_;
  auVar98._12_4_ = auVar74._12_4_ * auVar86._12_4_;
  auVar98._16_4_ = auVar86._16_4_ * 0.0;
  auVar98._20_4_ = auVar86._20_4_ * 0.0;
  auVar98._24_4_ = auVar86._24_4_ * 0.0;
  auVar98._28_4_ = 0;
  auVar86 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 0xe + 6));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,ZEXT1632(auVar76));
  auVar91._4_4_ = auVar75._4_4_ * auVar86._4_4_;
  auVar91._0_4_ = auVar75._0_4_ * auVar86._0_4_;
  auVar91._8_4_ = auVar75._8_4_ * auVar86._8_4_;
  auVar91._12_4_ = auVar75._12_4_ * auVar86._12_4_;
  auVar91._16_4_ = auVar86._16_4_ * 0.0;
  auVar91._20_4_ = auVar86._20_4_ * 0.0;
  auVar91._24_4_ = auVar86._24_4_ * 0.0;
  auVar91._28_4_ = auVar86._28_4_;
  auVar85 = vpbroadcastd_avx512vl();
  auVar86 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,ZEXT1632(auVar76));
  auVar84 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 0x15 + 6));
  auVar96._0_4_ = auVar75._0_4_ * auVar86._0_4_;
  auVar96._4_4_ = auVar75._4_4_ * auVar86._4_4_;
  auVar96._8_4_ = auVar75._8_4_ * auVar86._8_4_;
  auVar96._12_4_ = auVar75._12_4_ * auVar86._12_4_;
  auVar96._16_4_ = auVar86._16_4_ * 0.0;
  auVar96._20_4_ = auVar86._20_4_ * 0.0;
  auVar96._24_4_ = auVar86._24_4_ * 0.0;
  auVar96._28_4_ = 0;
  auVar86 = vcvtdq2ps_avx(auVar84);
  auVar86 = vsubps_avx(auVar86,ZEXT1632(auVar73));
  auVar92._4_4_ = auVar86._4_4_ * auVar72._4_4_;
  auVar92._0_4_ = auVar86._0_4_ * auVar72._0_4_;
  auVar92._8_4_ = auVar86._8_4_ * auVar72._8_4_;
  auVar92._12_4_ = auVar86._12_4_ * auVar72._12_4_;
  auVar92._16_4_ = auVar86._16_4_ * 0.0;
  auVar92._20_4_ = auVar86._20_4_ * 0.0;
  auVar92._24_4_ = auVar86._24_4_ * 0.0;
  auVar92._28_4_ = auVar86._28_4_;
  auVar86 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 0x17 + 6));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,ZEXT1632(auVar73));
  auVar95._0_4_ = auVar72._0_4_ * auVar86._0_4_;
  auVar95._4_4_ = auVar72._4_4_ * auVar86._4_4_;
  auVar95._8_4_ = auVar72._8_4_ * auVar86._8_4_;
  auVar95._12_4_ = auVar72._12_4_ * auVar86._12_4_;
  auVar95._16_4_ = auVar86._16_4_ * 0.0;
  auVar95._20_4_ = auVar86._20_4_ * 0.0;
  auVar95._24_4_ = auVar86._24_4_ * 0.0;
  auVar95._28_4_ = 0;
  auVar86 = vpminsd_avx2(auVar90,auVar98);
  auVar84 = vpminsd_avx2(auVar91,auVar96);
  auVar86 = vmaxps_avx(auVar86,auVar84);
  auVar84 = vpminsd_avx2(auVar92,auVar95);
  uVar155 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar87._4_4_ = uVar155;
  auVar87._0_4_ = uVar155;
  auVar87._8_4_ = uVar155;
  auVar87._12_4_ = uVar155;
  auVar87._16_4_ = uVar155;
  auVar87._20_4_ = uVar155;
  auVar87._24_4_ = uVar155;
  auVar87._28_4_ = uVar155;
  auVar84 = vmaxps_avx512vl(auVar84,auVar87);
  auVar86 = vmaxps_avx(auVar86,auVar84);
  auVar84._8_4_ = 0x3f7ffffa;
  auVar84._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar84._12_4_ = 0x3f7ffffa;
  auVar84._16_4_ = 0x3f7ffffa;
  auVar84._20_4_ = 0x3f7ffffa;
  auVar84._24_4_ = 0x3f7ffffa;
  auVar84._28_4_ = 0x3f7ffffa;
  local_340 = vmulps_avx512vl(auVar86,auVar84);
  auVar86 = vpmaxsd_avx2(auVar90,auVar98);
  auVar84 = vpmaxsd_avx2(auVar91,auVar96);
  auVar86 = vminps_avx(auVar86,auVar84);
  auVar84 = vpmaxsd_avx2(auVar92,auVar95);
  uVar155 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar88._4_4_ = uVar155;
  auVar88._0_4_ = uVar155;
  auVar88._8_4_ = uVar155;
  auVar88._12_4_ = uVar155;
  auVar88._16_4_ = uVar155;
  auVar88._20_4_ = uVar155;
  auVar88._24_4_ = uVar155;
  auVar88._28_4_ = uVar155;
  auVar84 = vminps_avx512vl(auVar84,auVar88);
  auVar86 = vminps_avx(auVar86,auVar84);
  auVar89._8_4_ = 0x3f800003;
  auVar89._0_8_ = 0x3f8000033f800003;
  auVar89._12_4_ = 0x3f800003;
  auVar89._16_4_ = 0x3f800003;
  auVar89._20_4_ = 0x3f800003;
  auVar89._24_4_ = 0x3f800003;
  auVar89._28_4_ = 0x3f800003;
  auVar86 = vmulps_avx512vl(auVar86,auVar89);
  uVar12 = vcmpps_avx512vl(local_340,auVar86,2);
  uVar14 = vpcmpgtd_avx512vl(auVar85,_DAT_01fb4ba0);
  local_798 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),(uint)(byte)((byte)uVar12 & (byte)uVar14));
  local_570 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_7a0 = prim;
LAB_01a3fce1:
  if (local_798 == 0) {
LAB_01a4269f:
    return local_798 != 0;
  }
  lVar16 = 0;
  for (uVar66 = local_798; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x8000000000000000) {
    lVar16 = lVar16 + 1;
  }
  local_8b8 = (ulong)*(uint *)(prim + 2);
  pGVar2 = (context->scene->geometries).items[local_8b8].ptr;
  uVar66 = (ulong)*(uint *)(*(long *)&pGVar2->field_0x58 +
                           pGVar2[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar16 * 4 + 6));
  p_Var3 = pGVar2[1].intersectionFilterN;
  lVar16 = *(long *)&pGVar2[1].time_range.upper;
  auVar74 = *(undefined1 (*) [16])(lVar16 + (long)p_Var3 * uVar66);
  auVar75 = *(undefined1 (*) [16])(lVar16 + (uVar66 + 1) * (long)p_Var3);
  local_608 = local_798 - 1 & local_798;
  if (local_608 != 0) {
    uVar68 = local_608 - 1 & local_608;
    for (uVar70 = local_608; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x8000000000000000) {
    }
    if (uVar68 != 0) {
      for (; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar72 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar1 = vinsertps_avx(auVar72,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar155 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar247._4_4_ = uVar155;
  auVar247._0_4_ = uVar155;
  auVar247._8_4_ = uVar155;
  auVar247._12_4_ = uVar155;
  local_460._16_4_ = uVar155;
  local_460._0_16_ = auVar247;
  local_460._20_4_ = uVar155;
  local_460._24_4_ = uVar155;
  local_460._28_4_ = uVar155;
  uVar155 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar252._4_4_ = uVar155;
  auVar252._0_4_ = uVar155;
  auVar252._8_4_ = uVar155;
  auVar252._12_4_ = uVar155;
  local_480._16_4_ = uVar155;
  local_480._0_16_ = auVar252;
  local_480._20_4_ = uVar155;
  local_480._24_4_ = uVar155;
  local_480._28_4_ = uVar155;
  auVar72 = vunpcklps_avx(auVar247,auVar252);
  fVar214 = *(float *)(ray + k * 4 + 0x60);
  auVar253._4_4_ = fVar214;
  auVar253._0_4_ = fVar214;
  auVar253._8_4_ = fVar214;
  auVar253._12_4_ = fVar214;
  local_4a0._16_4_ = fVar214;
  local_4a0._0_16_ = auVar253;
  local_4a0._20_4_ = fVar214;
  local_4a0._24_4_ = fVar214;
  local_4a0._28_4_ = fVar214;
  local_710 = vinsertps_avx(auVar72,auVar253,0x28);
  auVar220._0_4_ = auVar74._0_4_ + auVar75._0_4_;
  auVar220._4_4_ = auVar74._4_4_ + auVar75._4_4_;
  auVar220._8_4_ = auVar74._8_4_ + auVar75._8_4_;
  auVar220._12_4_ = auVar74._12_4_ + auVar75._12_4_;
  auVar11._8_4_ = 0x3f000000;
  auVar11._0_8_ = 0x3f0000003f000000;
  auVar11._12_4_ = 0x3f000000;
  auVar72 = vmulps_avx512vl(auVar220,auVar11);
  auVar72 = vsubps_avx(auVar72,auVar1);
  auVar72 = vdpps_avx(auVar72,local_710,0x7f);
  fVar138 = *(float *)(ray + k * 4 + 0x30);
  auVar244 = ZEXT464((uint)fVar138);
  local_720 = vdpps_avx(local_710,local_710,0x7f);
  auVar246 = ZEXT1664(local_720);
  auVar80._4_12_ = ZEXT812(0) << 0x20;
  auVar80._0_4_ = local_720._0_4_;
  auVar73 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar80);
  auVar76 = vfnmadd213ss_fma(auVar73,local_720,ZEXT416(0x40000000));
  local_320 = auVar72._0_4_ * auVar73._0_4_ * auVar76._0_4_;
  auVar226._4_4_ = local_320;
  auVar226._0_4_ = local_320;
  auVar226._8_4_ = local_320;
  auVar226._12_4_ = local_320;
  fStack_430 = local_320;
  _local_440 = auVar226;
  fStack_42c = local_320;
  fStack_428 = local_320;
  fStack_424 = local_320;
  auVar72 = vfmadd231ps_fma(auVar1,local_710,auVar226);
  auVar72 = vblendps_avx(auVar72,ZEXT816(0) << 0x40,8);
  auVar74 = vsubps_avx(auVar74,auVar72);
  auVar1 = vsubps_avx(*(undefined1 (*) [16])(lVar16 + (uVar66 + 2) * (long)p_Var3),auVar72);
  auVar235 = ZEXT1664(auVar1);
  auVar75 = vsubps_avx(auVar75,auVar72);
  auVar240 = ZEXT1664(auVar75);
  auVar72 = vsubps_avx(*(undefined1 (*) [16])(lVar16 + (uVar66 + 3) * (long)p_Var3),auVar72);
  auVar86 = vbroadcastss_avx512vl(auVar74);
  auVar106._8_4_ = 1;
  auVar106._0_8_ = 0x100000001;
  auVar106._12_4_ = 1;
  auVar106._16_4_ = 1;
  auVar106._20_4_ = 1;
  auVar106._24_4_ = 1;
  auVar106._28_4_ = 1;
  local_6a0 = ZEXT1632(auVar74);
  auVar84 = vpermps_avx512vl(auVar106,local_6a0);
  auVar107._8_4_ = 2;
  auVar107._0_8_ = 0x200000002;
  auVar107._12_4_ = 2;
  auVar107._16_4_ = 2;
  auVar107._20_4_ = 2;
  auVar107._24_4_ = 2;
  auVar107._28_4_ = 2;
  auVar87 = vpermps_avx512vl(auVar107,local_6a0);
  auVar108._8_4_ = 3;
  auVar108._0_8_ = 0x300000003;
  auVar108._12_4_ = 3;
  auVar108._16_4_ = 3;
  auVar108._20_4_ = 3;
  auVar108._24_4_ = 3;
  auVar108._28_4_ = 3;
  auVar88 = vpermps_avx512vl(auVar108,local_6a0);
  auVar89 = vbroadcastss_avx512vl(auVar75);
  local_6e0 = ZEXT1632(auVar75);
  auVar85 = vpermps_avx512vl(auVar106,local_6e0);
  local_820 = vpermps_avx512vl(auVar107,local_6e0);
  auVar254 = ZEXT3264(local_820);
  local_840 = vpermps_avx512vl(auVar108,local_6e0);
  auVar255 = ZEXT3264(local_840);
  local_860 = vbroadcastss_avx512vl(auVar1);
  auVar256 = ZEXT3264(local_860);
  local_6c0 = ZEXT1632(auVar1);
  local_880 = vpermps_avx512vl(auVar106,local_6c0);
  auVar257 = ZEXT3264(local_880);
  local_280 = vpermps_avx512vl(auVar107,local_6c0);
  local_2a0 = vpermps_avx512vl(auVar108,local_6c0);
  local_260 = vbroadcastss_avx512vl(auVar72);
  _local_700 = ZEXT1632(auVar72);
  local_2e0 = vpermps_avx2(auVar106,_local_700);
  local_220 = vpermps_avx2(auVar107,_local_700);
  local_300 = vpermps_avx2(auVar108,_local_700);
  auVar74 = vfmadd231ps_fma(ZEXT432((uint)(fVar214 * fVar214)),local_480,local_480);
  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),local_460,local_460);
  local_240._0_4_ = auVar74._0_4_;
  local_240._4_4_ = local_240._0_4_;
  local_240._8_4_ = local_240._0_4_;
  local_240._12_4_ = local_240._0_4_;
  local_240._16_4_ = local_240._0_4_;
  local_240._20_4_ = local_240._0_4_;
  local_240._24_4_ = local_240._0_4_;
  local_240._28_4_ = local_240._0_4_;
  auVar105._8_4_ = 0x7fffffff;
  auVar105._0_8_ = 0x7fffffff7fffffff;
  auVar105._12_4_ = 0x7fffffff;
  auVar105._16_4_ = 0x7fffffff;
  auVar105._20_4_ = 0x7fffffff;
  auVar105._24_4_ = 0x7fffffff;
  auVar105._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_240,auVar105);
  local_650 = ZEXT416((uint)local_320);
  local_320 = fVar138 - local_320;
  fStack_31c = local_320;
  fStack_318 = local_320;
  fStack_314 = local_320;
  fStack_310 = local_320;
  fStack_30c = local_320;
  fStack_308 = local_320;
  fStack_304 = local_320;
  local_550 = vpbroadcastd_avx512vl();
  uVar66 = 0;
  bVar64 = 0;
  local_a2c = 1;
  local_560 = vpbroadcastd_avx512vl();
  auVar74 = vsqrtss_avx(local_720,local_720);
  local_8a4 = auVar74._0_4_;
  auVar74 = vsqrtss_avx(local_720,local_720);
  local_8a8 = auVar74._0_4_;
  local_3d0 = ZEXT816(0x3f80000000000000);
  auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar258 = ZEXT3264(auVar90);
  auVar225 = ZEXT3264(_DAT_01f7b040);
  local_2c0 = local_260;
  do {
    auVar74 = vmovshdup_avx(local_3d0);
    auVar74 = vsubps_avx(auVar74,local_3d0);
    auVar139._0_4_ = auVar74._0_4_;
    fVar214 = auVar139._0_4_ * 0.04761905;
    uVar155 = local_3d0._0_4_;
    auVar217._4_4_ = uVar155;
    auVar217._0_4_ = uVar155;
    auVar217._8_4_ = uVar155;
    auVar217._12_4_ = uVar155;
    auVar217._16_4_ = uVar155;
    auVar217._20_4_ = uVar155;
    auVar217._24_4_ = uVar155;
    auVar217._28_4_ = uVar155;
    auVar139._4_4_ = auVar139._0_4_;
    auVar139._8_4_ = auVar139._0_4_;
    auVar139._12_4_ = auVar139._0_4_;
    local_800._16_4_ = auVar139._0_4_;
    local_800._0_16_ = auVar139;
    local_800._20_4_ = auVar139._0_4_;
    local_800._24_4_ = auVar139._0_4_;
    local_800._28_4_ = auVar139._0_4_;
    auVar74 = vfmadd231ps_fma(auVar217,local_800,auVar225._0_32_);
    auVar90 = vsubps_avx512vl(auVar258._0_32_,ZEXT1632(auVar74));
    fVar193 = auVar74._0_4_;
    fVar209 = auVar74._4_4_;
    fVar210 = auVar74._8_4_;
    fVar211 = auVar74._12_4_;
    fVar213 = auVar90._0_4_;
    fVar192 = auVar90._4_4_;
    fVar228 = auVar90._8_4_;
    fVar229 = auVar90._12_4_;
    fVar172 = auVar90._16_4_;
    fVar230 = auVar90._20_4_;
    fVar231 = auVar90._24_4_;
    auVar116._4_4_ = fVar192 * fVar192 * -fVar209;
    auVar116._0_4_ = fVar213 * fVar213 * -fVar193;
    auVar116._8_4_ = fVar228 * fVar228 * -fVar210;
    auVar116._12_4_ = fVar229 * fVar229 * -fVar211;
    auVar116._16_4_ = fVar172 * fVar172 * -0.0;
    auVar116._20_4_ = fVar230 * fVar230 * -0.0;
    auVar116._24_4_ = fVar231 * fVar231 * -0.0;
    auVar116._28_4_ = 0x80000000;
    auVar235._0_28_ =
         ZEXT1628(CONCAT412(fVar211 * fVar211,
                            CONCAT48(fVar210 * fVar210,CONCAT44(fVar209 * fVar209,fVar193 * fVar193)
                                    )));
    fVar236 = fVar193 * 3.0;
    fVar241 = fVar209 * 3.0;
    fVar242 = fVar210 * 3.0;
    fVar243 = fVar211 * 3.0;
    auVar258._28_36_ = auVar240._28_36_;
    auVar258._0_28_ = ZEXT1628(CONCAT412(fVar243,CONCAT48(fVar242,CONCAT44(fVar241,fVar236))));
    auVar167._0_4_ = (fVar236 + -5.0) * fVar193 * fVar193;
    auVar167._4_4_ = (fVar241 + -5.0) * fVar209 * fVar209;
    auVar167._8_4_ = (fVar242 + -5.0) * fVar210 * fVar210;
    auVar167._12_4_ = (fVar243 + -5.0) * fVar211 * fVar211;
    auVar167._16_4_ = 0x80000000;
    auVar167._20_4_ = 0x80000000;
    auVar167._24_4_ = 0x80000000;
    auVar167._28_4_ = 0;
    auVar91 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
    auVar92 = vaddps_avx512vl(auVar167,auVar91);
    auVar245._0_4_ = fVar213 * fVar213;
    auVar245._4_4_ = fVar192 * fVar192;
    auVar245._8_4_ = fVar228 * fVar228;
    auVar245._12_4_ = fVar229 * fVar229;
    auVar245._16_4_ = fVar172 * fVar172;
    auVar245._20_4_ = fVar230 * fVar230;
    auVar245._28_36_ = auVar244._28_36_;
    auVar245._24_4_ = fVar231 * fVar231;
    auVar117._4_4_ = auVar245._4_4_ * (fVar192 * 3.0 + -5.0);
    auVar117._0_4_ = auVar245._0_4_ * (fVar213 * 3.0 + -5.0);
    auVar117._8_4_ = auVar245._8_4_ * (fVar228 * 3.0 + -5.0);
    auVar117._12_4_ = auVar245._12_4_ * (fVar229 * 3.0 + -5.0);
    auVar117._16_4_ = auVar245._16_4_ * (fVar172 * 3.0 + -5.0);
    auVar117._20_4_ = auVar245._20_4_ * (fVar230 * 3.0 + -5.0);
    auVar117._24_4_ = auVar245._24_4_ * (fVar231 * 3.0 + -5.0);
    auVar117._28_4_ = auVar246._28_4_ + -5.0;
    auVar93 = vaddps_avx512vl(auVar117,auVar91);
    fVar212 = auVar90._28_4_;
    auVar33._4_4_ = fVar209 * fVar209 * -fVar192;
    auVar33._0_4_ = fVar193 * fVar193 * -fVar213;
    auVar33._8_4_ = fVar210 * fVar210 * -fVar228;
    auVar33._12_4_ = fVar211 * fVar211 * -fVar229;
    auVar33._16_4_ = -fVar172 * 0.0 * 0.0;
    auVar33._20_4_ = -fVar230 * 0.0 * 0.0;
    auVar33._24_4_ = -fVar231 * 0.0 * 0.0;
    auVar33._28_4_ = -fVar212;
    auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar90 = vmulps_avx512vl(auVar116,auVar94);
    auVar83 = vmulps_avx512vl(auVar92,auVar94);
    auVar93 = vmulps_avx512vl(auVar93,auVar94);
    auVar81 = vmulps_avx512vl(auVar33,auVar94);
    auVar82 = vmulps_avx512vl(local_2c0,auVar81);
    auVar34._4_4_ = local_2e0._4_4_ * auVar81._4_4_;
    auVar34._0_4_ = local_2e0._0_4_ * auVar81._0_4_;
    auVar34._8_4_ = local_2e0._8_4_ * auVar81._8_4_;
    auVar34._12_4_ = local_2e0._12_4_ * auVar81._12_4_;
    auVar34._16_4_ = local_2e0._16_4_ * auVar81._16_4_;
    auVar34._20_4_ = local_2e0._20_4_ * auVar81._20_4_;
    auVar34._24_4_ = local_2e0._24_4_ * auVar81._24_4_;
    auVar34._28_4_ = auVar92._28_4_;
    auVar92 = vmulps_avx512vl(local_220,auVar81);
    auVar35._4_4_ = local_300._4_4_ * auVar81._4_4_;
    auVar35._0_4_ = local_300._0_4_ * auVar81._0_4_;
    auVar35._8_4_ = local_300._8_4_ * auVar81._8_4_;
    auVar35._12_4_ = local_300._12_4_ * auVar81._12_4_;
    auVar35._16_4_ = local_300._16_4_ * auVar81._16_4_;
    auVar35._20_4_ = local_300._20_4_ * auVar81._20_4_;
    auVar35._24_4_ = local_300._24_4_ * auVar81._24_4_;
    auVar35._28_4_ = auVar81._28_4_;
    auVar81 = vfmadd231ps_avx512vl(auVar82,auVar93,auVar256._0_32_);
    auVar82 = vfmadd231ps_avx512vl(auVar34,auVar93,auVar257._0_32_);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar93,local_280);
    auVar93 = vfmadd231ps_avx512vl(auVar35,local_2a0,auVar93);
    auVar81 = vfmadd231ps_avx512vl(auVar81,auVar83,auVar89);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar83,auVar85);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar83,auVar254._0_32_);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar255._0_32_,auVar83);
    auVar81 = vfmadd231ps_avx512vl(auVar81,auVar90,auVar86);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar90,auVar84);
    auVar95 = vfmadd231ps_avx512vl(auVar92,auVar90,auVar87);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar88,auVar90);
    auVar36._4_4_ = (fVar192 + fVar192) * fVar209;
    auVar36._0_4_ = (fVar213 + fVar213) * fVar193;
    auVar36._8_4_ = (fVar228 + fVar228) * fVar210;
    auVar36._12_4_ = (fVar229 + fVar229) * fVar211;
    auVar36._16_4_ = (fVar172 + fVar172) * 0.0;
    auVar36._20_4_ = (fVar230 + fVar230) * 0.0;
    auVar36._24_4_ = (fVar231 + fVar231) * 0.0;
    auVar36._28_4_ = auVar83._28_4_;
    auVar90 = vsubps_avx(auVar36,auVar245._0_32_);
    auVar218._0_28_ =
         ZEXT1628(CONCAT412((fVar211 + fVar211) * (fVar243 + -5.0) + fVar243 * fVar211,
                            CONCAT48((fVar210 + fVar210) * (fVar242 + -5.0) + fVar242 * fVar210,
                                     CONCAT44((fVar209 + fVar209) * (fVar241 + -5.0) +
                                              fVar241 * fVar209,
                                              (fVar193 + fVar193) * (fVar236 + -5.0) +
                                              fVar236 * fVar193))));
    auVar218._28_4_ = auVar240._28_4_ + -5.0 + 0.0;
    auVar91 = vaddps_avx512vl(auVar258._0_32_,auVar91);
    auVar37._4_4_ = (fVar192 + fVar192) * auVar91._4_4_;
    auVar37._0_4_ = (fVar213 + fVar213) * auVar91._0_4_;
    auVar37._8_4_ = (fVar228 + fVar228) * auVar91._8_4_;
    auVar37._12_4_ = (fVar229 + fVar229) * auVar91._12_4_;
    auVar37._16_4_ = (fVar172 + fVar172) * auVar91._16_4_;
    auVar37._20_4_ = (fVar230 + fVar230) * auVar91._20_4_;
    auVar37._24_4_ = (fVar231 + fVar231) * auVar91._24_4_;
    auVar37._28_4_ = auVar91._28_4_;
    auVar38._4_4_ = fVar192 * 3.0 * fVar192;
    auVar38._0_4_ = fVar213 * 3.0 * fVar213;
    auVar38._8_4_ = fVar228 * 3.0 * fVar228;
    auVar38._12_4_ = fVar229 * 3.0 * fVar229;
    auVar38._16_4_ = fVar172 * 3.0 * fVar172;
    auVar38._20_4_ = fVar230 * 3.0 * fVar230;
    auVar38._24_4_ = fVar231 * 3.0 * fVar231;
    auVar38._28_4_ = fVar212;
    auVar91 = vsubps_avx(auVar37,auVar38);
    auVar92 = vsubps_avx(auVar235._0_32_,auVar36);
    auVar96 = vmulps_avx512vl(auVar90,auVar94);
    auVar97 = vmulps_avx512vl(auVar218,auVar94);
    auVar91 = vmulps_avx512vl(auVar91,auVar94);
    auVar92 = vmulps_avx512vl(auVar92,auVar94);
    auVar94 = vmulps_avx512vl(local_2c0,auVar92);
    auVar39._4_4_ = local_2e0._4_4_ * auVar92._4_4_;
    auVar39._0_4_ = local_2e0._0_4_ * auVar92._0_4_;
    auVar39._8_4_ = local_2e0._8_4_ * auVar92._8_4_;
    auVar39._12_4_ = local_2e0._12_4_ * auVar92._12_4_;
    auVar39._16_4_ = local_2e0._16_4_ * auVar92._16_4_;
    auVar39._20_4_ = local_2e0._20_4_ * auVar92._20_4_;
    auVar39._24_4_ = local_2e0._24_4_ * auVar92._24_4_;
    auVar39._28_4_ = auVar90._28_4_;
    auVar90 = vmulps_avx512vl(local_220,auVar92);
    auVar40._4_4_ = local_300._4_4_ * auVar92._4_4_;
    auVar40._0_4_ = local_300._0_4_ * auVar92._0_4_;
    auVar40._8_4_ = local_300._8_4_ * auVar92._8_4_;
    auVar40._12_4_ = local_300._12_4_ * auVar92._12_4_;
    auVar40._16_4_ = local_300._16_4_ * auVar92._16_4_;
    auVar40._20_4_ = local_300._20_4_ * auVar92._20_4_;
    auVar40._24_4_ = local_300._24_4_ * auVar92._24_4_;
    auVar40._28_4_ = auVar92._28_4_;
    auVar92 = vfmadd231ps_avx512vl(auVar94,auVar91,auVar256._0_32_);
    auVar94 = vfmadd231ps_avx512vl(auVar39,auVar91,auVar257._0_32_);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar91,local_280);
    auVar91 = vfmadd231ps_avx512vl(auVar40,local_2a0,auVar91);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar97,auVar89);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar97,auVar85);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar97,auVar254._0_32_);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar255._0_32_,auVar97);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar96,auVar86);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar96,auVar84);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar96,auVar87);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar88,auVar96);
    auVar41._4_4_ = auVar92._4_4_ * fVar214;
    auVar41._0_4_ = auVar92._0_4_ * fVar214;
    auVar41._8_4_ = auVar92._8_4_ * fVar214;
    auVar41._12_4_ = auVar92._12_4_ * fVar214;
    auVar41._16_4_ = auVar92._16_4_ * fVar214;
    auVar41._20_4_ = auVar92._20_4_ * fVar214;
    auVar41._24_4_ = auVar92._24_4_ * fVar214;
    auVar41._28_4_ = fVar212 + fVar212;
    auVar42._4_4_ = auVar94._4_4_ * fVar214;
    auVar42._0_4_ = auVar94._0_4_ * fVar214;
    auVar42._8_4_ = auVar94._8_4_ * fVar214;
    auVar42._12_4_ = auVar94._12_4_ * fVar214;
    auVar42._16_4_ = auVar94._16_4_ * fVar214;
    auVar42._20_4_ = auVar94._20_4_ * fVar214;
    auVar42._24_4_ = auVar94._24_4_ * fVar214;
    auVar42._28_4_ = auVar83._28_4_;
    auVar43._4_4_ = auVar90._4_4_ * fVar214;
    auVar43._0_4_ = auVar90._0_4_ * fVar214;
    auVar43._8_4_ = auVar90._8_4_ * fVar214;
    auVar43._12_4_ = auVar90._12_4_ * fVar214;
    auVar43._16_4_ = auVar90._16_4_ * fVar214;
    auVar43._20_4_ = auVar90._20_4_ * fVar214;
    auVar43._24_4_ = auVar90._24_4_ * fVar214;
    auVar43._28_4_ = 0;
    fVar193 = fVar214 * auVar91._0_4_;
    fVar209 = fVar214 * auVar91._4_4_;
    auVar44._4_4_ = fVar209;
    auVar44._0_4_ = fVar193;
    fVar210 = fVar214 * auVar91._8_4_;
    auVar44._8_4_ = fVar210;
    fVar211 = fVar214 * auVar91._12_4_;
    auVar44._12_4_ = fVar211;
    fVar212 = fVar214 * auVar91._16_4_;
    auVar44._16_4_ = fVar212;
    fVar213 = fVar214 * auVar91._20_4_;
    auVar44._20_4_ = fVar213;
    fVar192 = fVar214 * auVar91._24_4_;
    auVar44._24_4_ = fVar192;
    auVar44._28_4_ = fVar214;
    auVar74 = vxorps_avx512vl(auVar255._0_16_,auVar255._0_16_);
    auVar83 = vpermt2ps_avx512vl(auVar81,_DAT_01fb9fc0,ZEXT1632(auVar74));
    auVar96 = vpermt2ps_avx512vl(auVar82,_DAT_01fb9fc0,ZEXT1632(auVar74));
    auVar244 = ZEXT3264(auVar96);
    auVar92 = ZEXT1632(auVar74);
    auVar97 = vpermt2ps_avx512vl(auVar95,_DAT_01fb9fc0,auVar92);
    auVar246 = ZEXT3264(auVar97);
    auVar219._0_4_ = auVar93._0_4_ + fVar193;
    auVar219._4_4_ = auVar93._4_4_ + fVar209;
    auVar219._8_4_ = auVar93._8_4_ + fVar210;
    auVar219._12_4_ = auVar93._12_4_ + fVar211;
    auVar219._16_4_ = auVar93._16_4_ + fVar212;
    auVar219._20_4_ = auVar93._20_4_ + fVar213;
    auVar219._24_4_ = auVar93._24_4_ + fVar192;
    auVar219._28_4_ = auVar93._28_4_ + fVar214;
    auVar90 = vmaxps_avx(auVar93,auVar219);
    auVar91 = vminps_avx(auVar93,auVar219);
    auVar98 = vpermt2ps_avx512vl(auVar93,_DAT_01fb9fc0,auVar92);
    auVar99 = vpermt2ps_avx512vl(auVar41,_DAT_01fb9fc0,auVar92);
    auVar100 = vpermt2ps_avx512vl(auVar42,_DAT_01fb9fc0,auVar92);
    auVar116 = ZEXT1632(auVar74);
    auVar101 = vpermt2ps_avx512vl(auVar43,_DAT_01fb9fc0,auVar116);
    auVar92 = vpermt2ps_avx512vl(auVar44,_DAT_01fb9fc0,auVar116);
    auVar102 = vsubps_avx512vl(auVar98,auVar92);
    auVar92 = vsubps_avx(auVar83,auVar81);
    auVar240 = ZEXT3264(auVar92);
    auVar93 = vsubps_avx(auVar96,auVar82);
    auVar235 = ZEXT3264(auVar93);
    auVar94 = vsubps_avx(auVar97,auVar95);
    auVar103 = vmulps_avx512vl(auVar93,auVar43);
    auVar103 = vfmsub231ps_avx512vl(auVar103,auVar42,auVar94);
    auVar104 = vmulps_avx512vl(auVar94,auVar41);
    auVar104 = vfmsub231ps_avx512vl(auVar104,auVar43,auVar92);
    auVar105 = vmulps_avx512vl(auVar92,auVar42);
    auVar105 = vfmsub231ps_avx512vl(auVar105,auVar41,auVar93);
    auVar105 = vmulps_avx512vl(auVar105,auVar105);
    auVar104 = vfmadd231ps_avx512vl(auVar105,auVar104,auVar104);
    auVar103 = vfmadd231ps_avx512vl(auVar104,auVar103,auVar103);
    auVar104 = vmulps_avx512vl(auVar94,auVar94);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar93,auVar93);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar92,auVar92);
    auVar105 = vrcp14ps_avx512vl(auVar104);
    auVar106 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar258 = ZEXT3264(auVar106);
    auVar107 = vfnmadd213ps_avx512vl(auVar105,auVar104,auVar106);
    auVar105 = vfmadd132ps_avx512vl(auVar107,auVar105,auVar105);
    auVar103 = vmulps_avx512vl(auVar103,auVar105);
    auVar107 = vmulps_avx512vl(auVar93,auVar101);
    auVar107 = vfmsub231ps_avx512vl(auVar107,auVar100,auVar94);
    auVar108 = vmulps_avx512vl(auVar94,auVar99);
    auVar108 = vfmsub231ps_avx512vl(auVar108,auVar101,auVar92);
    auVar109 = vmulps_avx512vl(auVar92,auVar100);
    auVar109 = vfmsub231ps_avx512vl(auVar109,auVar99,auVar93);
    auVar109 = vmulps_avx512vl(auVar109,auVar109);
    auVar108 = vfmadd231ps_avx512vl(auVar109,auVar108,auVar108);
    auVar107 = vfmadd231ps_avx512vl(auVar108,auVar107,auVar107);
    auVar105 = vmulps_avx512vl(auVar107,auVar105);
    auVar103 = vmaxps_avx512vl(auVar103,auVar105);
    auVar103 = vsqrtps_avx512vl(auVar103);
    auVar105 = vmaxps_avx512vl(auVar102,auVar98);
    auVar90 = vmaxps_avx512vl(auVar90,auVar105);
    auVar105 = vaddps_avx512vl(auVar103,auVar90);
    auVar90 = vminps_avx512vl(auVar102,auVar98);
    auVar90 = vminps_avx(auVar91,auVar90);
    auVar90 = vsubps_avx512vl(auVar90,auVar103);
    auVar109._8_4_ = 0x3f800002;
    auVar109._0_8_ = 0x3f8000023f800002;
    auVar109._12_4_ = 0x3f800002;
    auVar109._16_4_ = 0x3f800002;
    auVar109._20_4_ = 0x3f800002;
    auVar109._24_4_ = 0x3f800002;
    auVar109._28_4_ = 0x3f800002;
    auVar91 = vmulps_avx512vl(auVar105,auVar109);
    auVar110._8_4_ = 0x3f7ffffc;
    auVar110._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar110._12_4_ = 0x3f7ffffc;
    auVar110._16_4_ = 0x3f7ffffc;
    auVar110._20_4_ = 0x3f7ffffc;
    auVar110._24_4_ = 0x3f7ffffc;
    auVar110._28_4_ = 0x3f7ffffc;
    auVar90 = vmulps_avx512vl(auVar90,auVar110);
    auVar91 = vmulps_avx512vl(auVar91,auVar91);
    auVar98 = vrsqrt14ps_avx512vl(auVar104);
    auVar111._8_4_ = 0xbf000000;
    auVar111._0_8_ = 0xbf000000bf000000;
    auVar111._12_4_ = 0xbf000000;
    auVar111._16_4_ = 0xbf000000;
    auVar111._20_4_ = 0xbf000000;
    auVar111._24_4_ = 0xbf000000;
    auVar111._28_4_ = 0xbf000000;
    auVar102 = vmulps_avx512vl(auVar104,auVar111);
    fVar214 = auVar98._0_4_;
    fVar193 = auVar98._4_4_;
    fVar209 = auVar98._8_4_;
    fVar210 = auVar98._12_4_;
    fVar211 = auVar98._16_4_;
    fVar212 = auVar98._20_4_;
    fVar213 = auVar98._24_4_;
    auVar45._4_4_ = fVar193 * fVar193 * fVar193 * auVar102._4_4_;
    auVar45._0_4_ = fVar214 * fVar214 * fVar214 * auVar102._0_4_;
    auVar45._8_4_ = fVar209 * fVar209 * fVar209 * auVar102._8_4_;
    auVar45._12_4_ = fVar210 * fVar210 * fVar210 * auVar102._12_4_;
    auVar45._16_4_ = fVar211 * fVar211 * fVar211 * auVar102._16_4_;
    auVar45._20_4_ = fVar212 * fVar212 * fVar212 * auVar102._20_4_;
    auVar45._24_4_ = fVar213 * fVar213 * fVar213 * auVar102._24_4_;
    auVar45._28_4_ = auVar105._28_4_;
    auVar112._8_4_ = 0x3fc00000;
    auVar112._0_8_ = 0x3fc000003fc00000;
    auVar112._12_4_ = 0x3fc00000;
    auVar112._16_4_ = 0x3fc00000;
    auVar112._20_4_ = 0x3fc00000;
    auVar112._24_4_ = 0x3fc00000;
    auVar112._28_4_ = 0x3fc00000;
    auVar98 = vfmadd231ps_avx512vl(auVar45,auVar98,auVar112);
    auVar102 = vmulps_avx512vl(auVar92,auVar98);
    auVar103 = vmulps_avx512vl(auVar93,auVar98);
    auVar104 = vmulps_avx512vl(auVar94,auVar98);
    auVar105 = vsubps_avx512vl(auVar116,auVar81);
    auVar107 = vsubps_avx512vl(auVar116,auVar82);
    auVar108 = vsubps_avx512vl(auVar116,auVar95);
    auVar109 = vmulps_avx512vl(local_4a0,auVar108);
    auVar109 = vfmadd231ps_avx512vl(auVar109,local_480,auVar107);
    auVar109 = vfmadd231ps_avx512vl(auVar109,local_460,auVar105);
    auVar110 = vmulps_avx512vl(auVar108,auVar108);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar107,auVar107);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar105,auVar105);
    auVar111 = vmulps_avx512vl(local_4a0,auVar104);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar103,local_480);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar102,local_460);
    auVar104 = vmulps_avx512vl(auVar108,auVar104);
    auVar103 = vfmadd231ps_avx512vl(auVar104,auVar107,auVar103);
    auVar102 = vfmadd231ps_avx512vl(auVar103,auVar105,auVar102);
    auVar103 = vmulps_avx512vl(auVar111,auVar111);
    auVar104 = vsubps_avx512vl(local_240,auVar103);
    auVar112 = vmulps_avx512vl(auVar111,auVar102);
    auVar109 = vsubps_avx512vl(auVar109,auVar112);
    auVar109 = vaddps_avx512vl(auVar109,auVar109);
    auVar112 = vmulps_avx512vl(auVar102,auVar102);
    local_680 = vsubps_avx512vl(auVar110,auVar112);
    auVar91 = vsubps_avx512vl(local_680,auVar91);
    local_7c0 = vmulps_avx512vl(auVar109,auVar109);
    auVar113._8_4_ = 0x40800000;
    auVar113._0_8_ = 0x4080000040800000;
    auVar113._12_4_ = 0x40800000;
    auVar113._16_4_ = 0x40800000;
    auVar113._20_4_ = 0x40800000;
    auVar113._24_4_ = 0x40800000;
    auVar113._28_4_ = 0x40800000;
    _local_5a0 = vmulps_avx512vl(auVar104,auVar113);
    auVar110 = vmulps_avx512vl(_local_5a0,auVar91);
    auVar110 = vsubps_avx512vl(local_7c0,auVar110);
    uVar70 = vcmpps_avx512vl(auVar110,auVar116,5);
    bVar62 = (byte)uVar70;
    if (bVar62 == 0) {
LAB_01a40a3c:
      auVar225 = ZEXT3264(_DAT_01f7b040);
      auVar254 = ZEXT3264(local_820);
      auVar255 = ZEXT3264(local_840);
      auVar256 = ZEXT3264(local_860);
      auVar257 = ZEXT3264(local_880);
    }
    else {
      auVar110 = vsqrtps_avx512vl(auVar110);
      auVar112 = vaddps_avx512vl(auVar104,auVar104);
      local_5c0 = vrcp14ps_avx512vl(auVar112);
      auVar106 = vfnmadd213ps_avx512vl(local_5c0,auVar112,auVar106);
      auVar106 = vfmadd132ps_avx512vl(auVar106,local_5c0,local_5c0);
      auVar25._8_4_ = 0x80000000;
      auVar25._0_8_ = 0x8000000080000000;
      auVar25._12_4_ = 0x80000000;
      auVar25._16_4_ = 0x80000000;
      auVar25._20_4_ = 0x80000000;
      auVar25._24_4_ = 0x80000000;
      auVar25._28_4_ = 0x80000000;
      local_5e0 = vxorps_avx512vl(auVar109,auVar25);
      auVar113 = vsubps_avx512vl(local_5e0,auVar110);
      local_7e0 = vmulps_avx512vl(auVar113,auVar106);
      auVar110 = vsubps_avx512vl(auVar110,auVar109);
      local_600 = vmulps_avx512vl(auVar110,auVar106);
      auVar106 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar110 = vblendmps_avx512vl(auVar106,local_7e0);
      auVar114._0_4_ =
           (uint)(bVar62 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar106._0_4_;
      bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar114._4_4_ = (uint)bVar69 * auVar110._4_4_ | (uint)!bVar69 * auVar106._4_4_;
      bVar69 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar114._8_4_ = (uint)bVar69 * auVar110._8_4_ | (uint)!bVar69 * auVar106._8_4_;
      bVar69 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar114._12_4_ = (uint)bVar69 * auVar110._12_4_ | (uint)!bVar69 * auVar106._12_4_;
      bVar69 = (bool)((byte)(uVar70 >> 4) & 1);
      auVar114._16_4_ = (uint)bVar69 * auVar110._16_4_ | (uint)!bVar69 * auVar106._16_4_;
      bVar69 = (bool)((byte)(uVar70 >> 5) & 1);
      auVar114._20_4_ = (uint)bVar69 * auVar110._20_4_ | (uint)!bVar69 * auVar106._20_4_;
      bVar69 = (bool)((byte)(uVar70 >> 6) & 1);
      auVar114._24_4_ = (uint)bVar69 * auVar110._24_4_ | (uint)!bVar69 * auVar106._24_4_;
      bVar69 = SUB81(uVar70 >> 7,0);
      auVar114._28_4_ = (uint)bVar69 * auVar110._28_4_ | (uint)!bVar69 * auVar106._28_4_;
      auVar106 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar110 = vblendmps_avx512vl(auVar106,local_600);
      auVar115._0_4_ =
           (uint)(bVar62 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar106._0_4_;
      bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar115._4_4_ = (uint)bVar69 * auVar110._4_4_ | (uint)!bVar69 * auVar106._4_4_;
      bVar69 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar115._8_4_ = (uint)bVar69 * auVar110._8_4_ | (uint)!bVar69 * auVar106._8_4_;
      bVar69 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar115._12_4_ = (uint)bVar69 * auVar110._12_4_ | (uint)!bVar69 * auVar106._12_4_;
      bVar69 = (bool)((byte)(uVar70 >> 4) & 1);
      auVar115._16_4_ = (uint)bVar69 * auVar110._16_4_ | (uint)!bVar69 * auVar106._16_4_;
      bVar69 = (bool)((byte)(uVar70 >> 5) & 1);
      auVar115._20_4_ = (uint)bVar69 * auVar110._20_4_ | (uint)!bVar69 * auVar106._20_4_;
      bVar69 = (bool)((byte)(uVar70 >> 6) & 1);
      auVar115._24_4_ = (uint)bVar69 * auVar110._24_4_ | (uint)!bVar69 * auVar106._24_4_;
      bVar69 = SUB81(uVar70 >> 7,0);
      auVar115._28_4_ = (uint)bVar69 * auVar110._28_4_ | (uint)!bVar69 * auVar106._28_4_;
      auVar106 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar103,auVar106);
      local_740 = vmaxps_avx512vl(local_260,auVar106);
      auVar26._8_4_ = 0x36000000;
      auVar26._0_8_ = 0x3600000036000000;
      auVar26._12_4_ = 0x36000000;
      auVar26._16_4_ = 0x36000000;
      auVar26._20_4_ = 0x36000000;
      auVar26._24_4_ = 0x36000000;
      auVar26._28_4_ = 0x36000000;
      local_760 = vmulps_avx512vl(local_740,auVar26);
      vandps_avx512vl(auVar104,auVar106);
      uVar68 = vcmpps_avx512vl(local_760,local_760,1);
      uVar70 = uVar70 & uVar68;
      bVar67 = (byte)uVar70;
      if (bVar67 != 0) {
        uVar68 = vcmpps_avx512vl(auVar91,_DAT_01f7b000,2);
        auVar91 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar103 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar104 = vblendmps_avx512vl(auVar91,auVar103);
        bVar65 = (byte)uVar68;
        uVar71 = (uint)(bVar65 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar65 & 1) * local_760._0_4_;
        bVar69 = (bool)((byte)(uVar68 >> 1) & 1);
        uVar131 = (uint)bVar69 * auVar104._4_4_ | (uint)!bVar69 * local_760._4_4_;
        bVar69 = (bool)((byte)(uVar68 >> 2) & 1);
        uVar132 = (uint)bVar69 * auVar104._8_4_ | (uint)!bVar69 * local_760._8_4_;
        bVar69 = (bool)((byte)(uVar68 >> 3) & 1);
        uVar133 = (uint)bVar69 * auVar104._12_4_ | (uint)!bVar69 * local_760._12_4_;
        bVar69 = (bool)((byte)(uVar68 >> 4) & 1);
        uVar134 = (uint)bVar69 * auVar104._16_4_ | (uint)!bVar69 * local_760._16_4_;
        bVar69 = (bool)((byte)(uVar68 >> 5) & 1);
        uVar135 = (uint)bVar69 * auVar104._20_4_ | (uint)!bVar69 * local_760._20_4_;
        bVar69 = (bool)((byte)(uVar68 >> 6) & 1);
        uVar136 = (uint)bVar69 * auVar104._24_4_ | (uint)!bVar69 * local_760._24_4_;
        bVar69 = SUB81(uVar68 >> 7,0);
        uVar137 = (uint)bVar69 * auVar104._28_4_ | (uint)!bVar69 * local_760._28_4_;
        auVar114._0_4_ = (bVar67 & 1) * uVar71 | !(bool)(bVar67 & 1) * auVar114._0_4_;
        bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar114._4_4_ = bVar69 * uVar131 | !bVar69 * auVar114._4_4_;
        bVar69 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar114._8_4_ = bVar69 * uVar132 | !bVar69 * auVar114._8_4_;
        bVar69 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar114._12_4_ = bVar69 * uVar133 | !bVar69 * auVar114._12_4_;
        bVar69 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar114._16_4_ = bVar69 * uVar134 | !bVar69 * auVar114._16_4_;
        bVar69 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar114._20_4_ = bVar69 * uVar135 | !bVar69 * auVar114._20_4_;
        bVar69 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar114._24_4_ = bVar69 * uVar136 | !bVar69 * auVar114._24_4_;
        bVar69 = SUB81(uVar70 >> 7,0);
        auVar114._28_4_ = bVar69 * uVar137 | !bVar69 * auVar114._28_4_;
        auVar91 = vblendmps_avx512vl(auVar103,auVar91);
        bVar69 = (bool)((byte)(uVar68 >> 1) & 1);
        bVar5 = (bool)((byte)(uVar68 >> 2) & 1);
        bVar6 = (bool)((byte)(uVar68 >> 3) & 1);
        bVar7 = (bool)((byte)(uVar68 >> 4) & 1);
        bVar8 = (bool)((byte)(uVar68 >> 5) & 1);
        bVar9 = (bool)((byte)(uVar68 >> 6) & 1);
        bVar10 = SUB81(uVar68 >> 7,0);
        auVar115._0_4_ =
             (uint)(bVar67 & 1) *
             ((uint)(bVar65 & 1) * auVar91._0_4_ | !(bool)(bVar65 & 1) * uVar71) |
             !(bool)(bVar67 & 1) * auVar115._0_4_;
        bVar4 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar115._4_4_ =
             (uint)bVar4 * ((uint)bVar69 * auVar91._4_4_ | !bVar69 * uVar131) |
             !bVar4 * auVar115._4_4_;
        bVar69 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar115._8_4_ =
             (uint)bVar69 * ((uint)bVar5 * auVar91._8_4_ | !bVar5 * uVar132) |
             !bVar69 * auVar115._8_4_;
        bVar69 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar115._12_4_ =
             (uint)bVar69 * ((uint)bVar6 * auVar91._12_4_ | !bVar6 * uVar133) |
             !bVar69 * auVar115._12_4_;
        bVar69 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar115._16_4_ =
             (uint)bVar69 * ((uint)bVar7 * auVar91._16_4_ | !bVar7 * uVar134) |
             !bVar69 * auVar115._16_4_;
        bVar69 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar115._20_4_ =
             (uint)bVar69 * ((uint)bVar8 * auVar91._20_4_ | !bVar8 * uVar135) |
             !bVar69 * auVar115._20_4_;
        bVar69 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar115._24_4_ =
             (uint)bVar69 * ((uint)bVar9 * auVar91._24_4_ | !bVar9 * uVar136) |
             !bVar69 * auVar115._24_4_;
        bVar69 = SUB81(uVar70 >> 7,0);
        auVar115._28_4_ =
             (uint)bVar69 * ((uint)bVar10 * auVar91._28_4_ | !bVar10 * uVar137) |
             !bVar69 * auVar115._28_4_;
        bVar62 = (~bVar67 | bVar65) & bVar62;
      }
      if ((bVar62 & 0x7f) == 0) {
        auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar258 = ZEXT3264(auVar90);
        goto LAB_01a40a3c;
      }
      auVar91 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar101 = vxorps_avx512vl(auVar101,auVar91);
      auVar99 = vxorps_avx512vl(auVar99,auVar91);
      auVar225 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
      auVar100 = vxorps_avx512vl(auVar100,auVar91);
      auVar74 = vsubss_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),ZEXT416((uint)local_650._0_4_)
                              );
      auVar103 = vbroadcastss_avx512vl(auVar74);
      auVar103 = vminps_avx512vl(auVar103,auVar115);
      auVar61._4_4_ = fStack_31c;
      auVar61._0_4_ = local_320;
      auVar61._8_4_ = fStack_318;
      auVar61._12_4_ = fStack_314;
      auVar61._16_4_ = fStack_310;
      auVar61._20_4_ = fStack_30c;
      auVar61._24_4_ = fStack_308;
      auVar61._28_4_ = fStack_304;
      auVar104 = vmaxps_avx512vl(auVar61,auVar114);
      auVar106 = vmulps_avx512vl(auVar108,auVar43);
      auVar106 = vfmadd213ps_avx512vl(auVar107,auVar42,auVar106);
      auVar74 = vfmadd213ps_fma(auVar105,auVar41,auVar106);
      auVar105 = vmulps_avx512vl(local_4a0,auVar43);
      auVar105 = vfmadd231ps_avx512vl(auVar105,local_480,auVar42);
      auVar105 = vfmadd231ps_avx512vl(auVar105,local_460,auVar41);
      auVar106 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar105,auVar106);
      auVar107 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar12 = vcmpps_avx512vl(auVar106,auVar107,1);
      auVar108 = vxorps_avx512vl(ZEXT1632(auVar74),auVar91);
      auVar110 = vrcp14ps_avx512vl(auVar105);
      auVar113 = vxorps_avx512vl(auVar105,auVar91);
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar117 = vfnmadd213ps_avx512vl(auVar110,auVar105,auVar116);
      auVar74 = vfmadd132ps_fma(auVar117,auVar110,auVar110);
      fVar214 = auVar74._0_4_ * auVar108._0_4_;
      fVar193 = auVar74._4_4_ * auVar108._4_4_;
      auVar46._4_4_ = fVar193;
      auVar46._0_4_ = fVar214;
      fVar209 = auVar74._8_4_ * auVar108._8_4_;
      auVar46._8_4_ = fVar209;
      fVar210 = auVar74._12_4_ * auVar108._12_4_;
      auVar46._12_4_ = fVar210;
      fVar211 = auVar108._16_4_ * 0.0;
      auVar46._16_4_ = fVar211;
      fVar212 = auVar108._20_4_ * 0.0;
      auVar46._20_4_ = fVar212;
      fVar213 = auVar108._24_4_ * 0.0;
      auVar46._24_4_ = fVar213;
      auVar46._28_4_ = auVar108._28_4_;
      uVar14 = vcmpps_avx512vl(auVar105,auVar113,1);
      bVar67 = (byte)uVar12 | (byte)uVar14;
      auVar250._8_4_ = 0xff800000;
      auVar250._0_8_ = 0xff800000ff800000;
      auVar250._12_4_ = 0xff800000;
      auVar250._16_4_ = 0xff800000;
      auVar250._20_4_ = 0xff800000;
      auVar250._24_4_ = 0xff800000;
      auVar250._28_4_ = 0xff800000;
      auVar110 = vblendmps_avx512vl(auVar46,auVar250);
      auVar118._0_4_ = (uint)(bVar67 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar67 & 1) * -0x800000;
      bVar69 = (bool)(bVar67 >> 1 & 1);
      auVar118._4_4_ = (uint)bVar69 * auVar110._4_4_ | (uint)!bVar69 * -0x800000;
      bVar69 = (bool)(bVar67 >> 2 & 1);
      auVar118._8_4_ = (uint)bVar69 * auVar110._8_4_ | (uint)!bVar69 * -0x800000;
      bVar69 = (bool)(bVar67 >> 3 & 1);
      auVar118._12_4_ = (uint)bVar69 * auVar110._12_4_ | (uint)!bVar69 * -0x800000;
      bVar69 = (bool)(bVar67 >> 4 & 1);
      auVar118._16_4_ = (uint)bVar69 * auVar110._16_4_ | (uint)!bVar69 * -0x800000;
      bVar69 = (bool)(bVar67 >> 5 & 1);
      auVar118._20_4_ = (uint)bVar69 * auVar110._20_4_ | (uint)!bVar69 * -0x800000;
      bVar69 = (bool)(bVar67 >> 6 & 1);
      auVar118._24_4_ = (uint)bVar69 * auVar110._24_4_ | (uint)!bVar69 * -0x800000;
      auVar118._28_4_ =
           (uint)(bVar67 >> 7) * auVar110._28_4_ | (uint)!(bool)(bVar67 >> 7) * -0x800000;
      auVar110 = vmaxps_avx512vl(auVar104,auVar118);
      uVar14 = vcmpps_avx512vl(auVar105,auVar113,6);
      bVar67 = (byte)uVar12 | (byte)uVar14;
      auVar119._0_4_ = (uint)(bVar67 & 1) * 0x7f800000 | (uint)!(bool)(bVar67 & 1) * (int)fVar214;
      bVar69 = (bool)(bVar67 >> 1 & 1);
      auVar119._4_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * (int)fVar193;
      bVar69 = (bool)(bVar67 >> 2 & 1);
      auVar119._8_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * (int)fVar209;
      bVar69 = (bool)(bVar67 >> 3 & 1);
      auVar119._12_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * (int)fVar210;
      bVar69 = (bool)(bVar67 >> 4 & 1);
      auVar119._16_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * (int)fVar211;
      bVar69 = (bool)(bVar67 >> 5 & 1);
      auVar119._20_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * (int)fVar212;
      bVar69 = (bool)(bVar67 >> 6 & 1);
      auVar119._24_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * (int)fVar213;
      auVar119._28_4_ =
           (uint)(bVar67 >> 7) * 0x7f800000 | (uint)!(bool)(bVar67 >> 7) * auVar108._28_4_;
      auVar103 = vminps_avx512vl(auVar103,auVar119);
      auVar74 = vxorps_avx512vl(auVar104._0_16_,auVar104._0_16_);
      auVar83 = vsubps_avx512vl(ZEXT1632(auVar74),auVar83);
      auVar96 = vsubps_avx512vl(ZEXT1632(auVar74),auVar96);
      auVar104 = ZEXT1632(auVar74);
      auVar97 = vsubps_avx512vl(auVar104,auVar97);
      auVar97 = vmulps_avx512vl(auVar97,auVar101);
      auVar96 = vfmadd231ps_avx512vl(auVar97,auVar100,auVar96);
      auVar83 = vfmadd231ps_avx512vl(auVar96,auVar99,auVar83);
      auVar96 = vmulps_avx512vl(local_4a0,auVar101);
      auVar96 = vfmadd231ps_avx512vl(auVar96,local_480,auVar100);
      auVar96 = vfmadd231ps_avx512vl(auVar96,local_460,auVar99);
      vandps_avx512vl(auVar96,auVar106);
      auVar258 = ZEXT3264(auVar116);
      uVar12 = vcmpps_avx512vl(auVar96,auVar107,1);
      auVar83 = vxorps_avx512vl(auVar83,auVar91);
      auVar97 = vrcp14ps_avx512vl(auVar96);
      auVar91 = vxorps_avx512vl(auVar96,auVar91);
      auVar246 = ZEXT3264(auVar91);
      auVar99 = vfnmadd213ps_avx512vl(auVar97,auVar96,auVar116);
      auVar74 = vfmadd132ps_fma(auVar99,auVar97,auVar97);
      fVar214 = auVar74._0_4_ * auVar83._0_4_;
      fVar193 = auVar74._4_4_ * auVar83._4_4_;
      auVar47._4_4_ = fVar193;
      auVar47._0_4_ = fVar214;
      fVar209 = auVar74._8_4_ * auVar83._8_4_;
      auVar47._8_4_ = fVar209;
      fVar210 = auVar74._12_4_ * auVar83._12_4_;
      auVar47._12_4_ = fVar210;
      fVar211 = auVar83._16_4_ * 0.0;
      auVar47._16_4_ = fVar211;
      fVar212 = auVar83._20_4_ * 0.0;
      auVar47._20_4_ = fVar212;
      fVar213 = auVar83._24_4_ * 0.0;
      auVar47._24_4_ = fVar213;
      auVar47._28_4_ = auVar83._28_4_;
      uVar14 = vcmpps_avx512vl(auVar96,auVar91,1);
      bVar67 = (byte)uVar12 | (byte)uVar14;
      auVar27._8_4_ = 0xff800000;
      auVar27._0_8_ = 0xff800000ff800000;
      auVar27._12_4_ = 0xff800000;
      auVar27._16_4_ = 0xff800000;
      auVar27._20_4_ = 0xff800000;
      auVar27._24_4_ = 0xff800000;
      auVar27._28_4_ = 0xff800000;
      auVar99 = vblendmps_avx512vl(auVar47,auVar27);
      auVar120._0_4_ =
           (uint)(bVar67 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar97._0_4_;
      bVar69 = (bool)(bVar67 >> 1 & 1);
      auVar120._4_4_ = (uint)bVar69 * auVar99._4_4_ | (uint)!bVar69 * auVar97._4_4_;
      bVar69 = (bool)(bVar67 >> 2 & 1);
      auVar120._8_4_ = (uint)bVar69 * auVar99._8_4_ | (uint)!bVar69 * auVar97._8_4_;
      bVar69 = (bool)(bVar67 >> 3 & 1);
      auVar120._12_4_ = (uint)bVar69 * auVar99._12_4_ | (uint)!bVar69 * auVar97._12_4_;
      bVar69 = (bool)(bVar67 >> 4 & 1);
      auVar120._16_4_ = (uint)bVar69 * auVar99._16_4_ | (uint)!bVar69 * auVar97._16_4_;
      bVar69 = (bool)(bVar67 >> 5 & 1);
      auVar120._20_4_ = (uint)bVar69 * auVar99._20_4_ | (uint)!bVar69 * auVar97._20_4_;
      bVar69 = (bool)(bVar67 >> 6 & 1);
      auVar120._24_4_ = (uint)bVar69 * auVar99._24_4_ | (uint)!bVar69 * auVar97._24_4_;
      auVar120._28_4_ =
           (uint)(bVar67 >> 7) * auVar99._28_4_ | (uint)!(bool)(bVar67 >> 7) * auVar97._28_4_;
      local_8a0 = vmaxps_avx(auVar110,auVar120);
      auVar244 = ZEXT3264(local_8a0);
      uVar14 = vcmpps_avx512vl(auVar96,auVar91,6);
      bVar67 = (byte)uVar12 | (byte)uVar14;
      auVar121._0_4_ = (uint)(bVar67 & 1) * 0x7f800000 | (uint)!(bool)(bVar67 & 1) * (int)fVar214;
      bVar69 = (bool)(bVar67 >> 1 & 1);
      auVar121._4_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * (int)fVar193;
      bVar69 = (bool)(bVar67 >> 2 & 1);
      auVar121._8_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * (int)fVar209;
      bVar69 = (bool)(bVar67 >> 3 & 1);
      auVar121._12_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * (int)fVar210;
      bVar69 = (bool)(bVar67 >> 4 & 1);
      auVar121._16_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * (int)fVar211;
      bVar69 = (bool)(bVar67 >> 5 & 1);
      auVar121._20_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * (int)fVar212;
      bVar69 = (bool)(bVar67 >> 6 & 1);
      auVar121._24_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * (int)fVar213;
      auVar121._28_4_ =
           (uint)(bVar67 >> 7) * 0x7f800000 | (uint)!(bool)(bVar67 >> 7) * auVar83._28_4_;
      local_380 = vminps_avx(auVar103,auVar121);
      uVar12 = vcmpps_avx512vl(local_8a0,local_380,2);
      bVar62 = bVar62 & 0x7f & (byte)uVar12;
      if (bVar62 == 0) goto LAB_01a40a3c;
      auVar91 = vmaxps_avx512vl(auVar104,auVar90);
      auVar90 = vfmadd213ps_avx512vl(local_7e0,auVar111,auVar102);
      fVar214 = auVar98._0_4_;
      fVar193 = auVar98._4_4_;
      auVar48._4_4_ = fVar193 * auVar90._4_4_;
      auVar48._0_4_ = fVar214 * auVar90._0_4_;
      fVar209 = auVar98._8_4_;
      auVar48._8_4_ = fVar209 * auVar90._8_4_;
      fVar210 = auVar98._12_4_;
      auVar48._12_4_ = fVar210 * auVar90._12_4_;
      fVar211 = auVar98._16_4_;
      auVar48._16_4_ = fVar211 * auVar90._16_4_;
      fVar212 = auVar98._20_4_;
      auVar48._20_4_ = fVar212 * auVar90._20_4_;
      fVar213 = auVar98._24_4_;
      auVar48._24_4_ = fVar213 * auVar90._24_4_;
      auVar48._28_4_ = auVar90._28_4_;
      auVar90 = vfmadd213ps_avx512vl(local_600,auVar111,auVar102);
      auVar49._4_4_ = fVar193 * auVar90._4_4_;
      auVar49._0_4_ = fVar214 * auVar90._0_4_;
      auVar49._8_4_ = fVar209 * auVar90._8_4_;
      auVar49._12_4_ = fVar210 * auVar90._12_4_;
      auVar49._16_4_ = fVar211 * auVar90._16_4_;
      auVar49._20_4_ = fVar212 * auVar90._20_4_;
      auVar49._24_4_ = fVar213 * auVar90._24_4_;
      auVar49._28_4_ = auVar90._28_4_;
      auVar90 = vminps_avx512vl(auVar48,auVar116);
      auVar56 = ZEXT812(0);
      auVar83 = ZEXT1232(auVar56) << 0x20;
      auVar90 = vmaxps_avx(auVar90,ZEXT1232(auVar56) << 0x20);
      auVar96 = vminps_avx512vl(auVar49,auVar116);
      auVar50._4_4_ = (auVar90._4_4_ + 1.0) * 0.125;
      auVar50._0_4_ = (auVar90._0_4_ + 0.0) * 0.125;
      auVar50._8_4_ = (auVar90._8_4_ + 2.0) * 0.125;
      auVar50._12_4_ = (auVar90._12_4_ + 3.0) * 0.125;
      auVar50._16_4_ = (auVar90._16_4_ + 4.0) * 0.125;
      auVar50._20_4_ = (auVar90._20_4_ + 5.0) * 0.125;
      auVar50._24_4_ = (auVar90._24_4_ + 6.0) * 0.125;
      auVar50._28_4_ = auVar90._28_4_ + 7.0;
      local_1e0 = vfmadd213ps_avx512vl(auVar50,local_800,auVar217);
      auVar90 = vmaxps_avx(auVar96,ZEXT1232(auVar56) << 0x20);
      auVar51._4_4_ = (auVar90._4_4_ + 1.0) * 0.125;
      auVar51._0_4_ = (auVar90._0_4_ + 0.0) * 0.125;
      auVar51._8_4_ = (auVar90._8_4_ + 2.0) * 0.125;
      auVar51._12_4_ = (auVar90._12_4_ + 3.0) * 0.125;
      auVar51._16_4_ = (auVar90._16_4_ + 4.0) * 0.125;
      auVar51._20_4_ = (auVar90._20_4_ + 5.0) * 0.125;
      auVar51._24_4_ = (auVar90._24_4_ + 6.0) * 0.125;
      auVar51._28_4_ = auVar90._28_4_ + 7.0;
      local_200 = vfmadd213ps_avx512vl(auVar51,local_800,auVar217);
      auVar52._4_4_ = auVar91._4_4_ * auVar91._4_4_;
      auVar52._0_4_ = auVar91._0_4_ * auVar91._0_4_;
      auVar52._8_4_ = auVar91._8_4_ * auVar91._8_4_;
      auVar52._12_4_ = auVar91._12_4_ * auVar91._12_4_;
      auVar52._16_4_ = auVar91._16_4_ * auVar91._16_4_;
      auVar52._20_4_ = auVar91._20_4_ * auVar91._20_4_;
      auVar52._24_4_ = auVar91._24_4_ * auVar91._24_4_;
      auVar52._28_4_ = auVar91._28_4_;
      auVar90 = vsubps_avx(local_680,auVar52);
      auVar53._4_4_ = auVar90._4_4_ * (float)local_5a0._4_4_;
      auVar53._0_4_ = auVar90._0_4_ * (float)local_5a0._0_4_;
      auVar53._8_4_ = auVar90._8_4_ * fStack_598;
      auVar53._12_4_ = auVar90._12_4_ * fStack_594;
      auVar53._16_4_ = auVar90._16_4_ * fStack_590;
      auVar53._20_4_ = auVar90._20_4_ * fStack_58c;
      auVar53._24_4_ = auVar90._24_4_ * fStack_588;
      auVar53._28_4_ = auVar91._28_4_;
      auVar91 = vsubps_avx(local_7c0,auVar53);
      uVar12 = vcmpps_avx512vl(auVar91,ZEXT1232(auVar56) << 0x20,5);
      bVar67 = (byte)uVar12;
      auVar254 = ZEXT3264(local_820);
      auVar255 = ZEXT3264(local_840);
      auVar256 = ZEXT3264(local_860);
      auVar257 = ZEXT3264(local_880);
      if (bVar67 == 0) {
        bVar67 = 0;
        auVar92 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar235 = ZEXT864(0) << 0x20;
        auVar91 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar96 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar244 = ZEXT864(0) << 0x20;
        auVar122._8_4_ = 0x7f800000;
        auVar122._0_8_ = 0x7f8000007f800000;
        auVar122._12_4_ = 0x7f800000;
        auVar122._16_4_ = 0x7f800000;
        auVar122._20_4_ = 0x7f800000;
        auVar122._24_4_ = 0x7f800000;
        auVar122._28_4_ = 0x7f800000;
        auVar123._8_4_ = 0xff800000;
        auVar123._0_8_ = 0xff800000ff800000;
        auVar123._12_4_ = 0xff800000;
        auVar123._16_4_ = 0xff800000;
        auVar123._20_4_ = 0xff800000;
        auVar123._24_4_ = 0xff800000;
        auVar123._28_4_ = 0xff800000;
      }
      else {
        auVar75 = vxorps_avx512vl(auVar139,auVar139);
        uVar70 = vcmpps_avx512vl(auVar91,auVar104,5);
        auVar91 = vsqrtps_avx(auVar91);
        auVar83 = vfnmadd213ps_avx512vl(auVar112,local_5c0,auVar116);
        auVar97 = vfmadd132ps_avx512vl(auVar83,local_5c0,local_5c0);
        auVar83 = vsubps_avx(local_5e0,auVar91);
        auVar99 = vmulps_avx512vl(auVar83,auVar97);
        auVar91 = vsubps_avx512vl(auVar91,auVar109);
        auVar97 = vmulps_avx512vl(auVar91,auVar97);
        auVar91 = vfmadd213ps_avx512vl(auVar111,auVar99,auVar102);
        auVar54._4_4_ = fVar193 * auVar91._4_4_;
        auVar54._0_4_ = fVar214 * auVar91._0_4_;
        auVar54._8_4_ = fVar209 * auVar91._8_4_;
        auVar54._12_4_ = fVar210 * auVar91._12_4_;
        auVar54._16_4_ = fVar211 * auVar91._16_4_;
        auVar54._20_4_ = fVar212 * auVar91._20_4_;
        auVar54._24_4_ = fVar213 * auVar91._24_4_;
        auVar54._28_4_ = auVar96._28_4_;
        auVar91 = vmulps_avx512vl(local_460,auVar99);
        auVar83 = vmulps_avx512vl(local_480,auVar99);
        auVar100 = vmulps_avx512vl(local_4a0,auVar99);
        auVar96 = vfmadd213ps_avx512vl(auVar92,auVar54,auVar81);
        auVar91 = vsubps_avx512vl(auVar91,auVar96);
        auVar96 = vfmadd213ps_avx512vl(auVar93,auVar54,auVar82);
        auVar96 = vsubps_avx512vl(auVar83,auVar96);
        auVar74 = vfmadd213ps_fma(auVar54,auVar94,auVar95);
        auVar83 = vsubps_avx(auVar100,ZEXT1632(auVar74));
        auVar244 = ZEXT3264(auVar83);
        auVar83 = vfmadd213ps_avx512vl(auVar111,auVar97,auVar102);
        auVar98 = vmulps_avx512vl(auVar98,auVar83);
        auVar83 = vmulps_avx512vl(local_460,auVar97);
        auVar100 = vmulps_avx512vl(local_480,auVar97);
        auVar101 = vmulps_avx512vl(local_4a0,auVar97);
        auVar74 = vfmadd213ps_fma(auVar92,auVar98,auVar81);
        auVar83 = vsubps_avx(auVar83,ZEXT1632(auVar74));
        auVar74 = vfmadd213ps_fma(auVar93,auVar98,auVar82);
        auVar92 = vsubps_avx512vl(auVar100,ZEXT1632(auVar74));
        auVar74 = vfmadd213ps_fma(auVar94,auVar98,auVar95);
        auVar93 = vsubps_avx512vl(auVar101,ZEXT1632(auVar74));
        auVar235 = ZEXT3264(auVar93);
        auVar148._8_4_ = 0x7f800000;
        auVar148._0_8_ = 0x7f8000007f800000;
        auVar148._12_4_ = 0x7f800000;
        auVar148._16_4_ = 0x7f800000;
        auVar148._20_4_ = 0x7f800000;
        auVar148._24_4_ = 0x7f800000;
        auVar148._28_4_ = 0x7f800000;
        auVar93 = vblendmps_avx512vl(auVar148,auVar99);
        bVar69 = (bool)((byte)uVar70 & 1);
        auVar122._0_4_ = (uint)bVar69 * auVar93._0_4_ | (uint)!bVar69 * 0x7f800000;
        bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar122._4_4_ = (uint)bVar69 * auVar93._4_4_ | (uint)!bVar69 * 0x7f800000;
        bVar69 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar122._8_4_ = (uint)bVar69 * auVar93._8_4_ | (uint)!bVar69 * 0x7f800000;
        bVar69 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar122._12_4_ = (uint)bVar69 * auVar93._12_4_ | (uint)!bVar69 * 0x7f800000;
        bVar69 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar122._16_4_ = (uint)bVar69 * auVar93._16_4_ | (uint)!bVar69 * 0x7f800000;
        bVar69 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar122._20_4_ = (uint)bVar69 * auVar93._20_4_ | (uint)!bVar69 * 0x7f800000;
        bVar69 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar122._24_4_ = (uint)bVar69 * auVar93._24_4_ | (uint)!bVar69 * 0x7f800000;
        bVar69 = SUB81(uVar70 >> 7,0);
        auVar122._28_4_ = (uint)bVar69 * auVar93._28_4_ | (uint)!bVar69 * 0x7f800000;
        auVar189._8_4_ = 0xff800000;
        auVar189._0_8_ = 0xff800000ff800000;
        auVar189._12_4_ = 0xff800000;
        auVar189._16_4_ = 0xff800000;
        auVar189._20_4_ = 0xff800000;
        auVar189._24_4_ = 0xff800000;
        auVar189._28_4_ = 0xff800000;
        auVar93 = vblendmps_avx512vl(auVar189,auVar97);
        bVar69 = (bool)((byte)uVar70 & 1);
        auVar123._0_4_ = (uint)bVar69 * auVar93._0_4_ | (uint)!bVar69 * -0x800000;
        bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar123._4_4_ = (uint)bVar69 * auVar93._4_4_ | (uint)!bVar69 * -0x800000;
        bVar69 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar123._8_4_ = (uint)bVar69 * auVar93._8_4_ | (uint)!bVar69 * -0x800000;
        bVar69 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar123._12_4_ = (uint)bVar69 * auVar93._12_4_ | (uint)!bVar69 * -0x800000;
        bVar69 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar123._16_4_ = (uint)bVar69 * auVar93._16_4_ | (uint)!bVar69 * -0x800000;
        bVar69 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar123._20_4_ = (uint)bVar69 * auVar93._20_4_ | (uint)!bVar69 * -0x800000;
        bVar69 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar123._24_4_ = (uint)bVar69 * auVar93._24_4_ | (uint)!bVar69 * -0x800000;
        bVar69 = SUB81(uVar70 >> 7,0);
        auVar123._28_4_ = (uint)bVar69 * auVar93._28_4_ | (uint)!bVar69 * -0x800000;
        auVar28._8_4_ = 0x36000000;
        auVar28._0_8_ = 0x3600000036000000;
        auVar28._12_4_ = 0x36000000;
        auVar28._16_4_ = 0x36000000;
        auVar28._20_4_ = 0x36000000;
        auVar28._24_4_ = 0x36000000;
        auVar28._28_4_ = 0x36000000;
        auVar93 = vmulps_avx512vl(local_740,auVar28);
        uVar68 = vcmpps_avx512vl(auVar93,local_760,0xe);
        uVar70 = uVar70 & uVar68;
        bVar65 = (byte)uVar70;
        if (bVar65 != 0) {
          uVar68 = vcmpps_avx512vl(auVar90,ZEXT1632(auVar75),2);
          auVar239._8_4_ = 0x7f800000;
          auVar239._0_8_ = 0x7f8000007f800000;
          auVar239._12_4_ = 0x7f800000;
          auVar239._16_4_ = 0x7f800000;
          auVar239._20_4_ = 0x7f800000;
          auVar239._24_4_ = 0x7f800000;
          auVar239._28_4_ = 0x7f800000;
          auVar251._8_4_ = 0xff800000;
          auVar251._0_8_ = 0xff800000ff800000;
          auVar251._12_4_ = 0xff800000;
          auVar251._16_4_ = 0xff800000;
          auVar251._20_4_ = 0xff800000;
          auVar251._24_4_ = 0xff800000;
          auVar251._28_4_ = 0xff800000;
          auVar90 = vblendmps_avx512vl(auVar239,auVar251);
          bVar63 = (byte)uVar68;
          uVar71 = (uint)(bVar63 & 1) * auVar90._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar93._0_4_;
          bVar69 = (bool)((byte)(uVar68 >> 1) & 1);
          uVar131 = (uint)bVar69 * auVar90._4_4_ | (uint)!bVar69 * auVar93._4_4_;
          bVar69 = (bool)((byte)(uVar68 >> 2) & 1);
          uVar132 = (uint)bVar69 * auVar90._8_4_ | (uint)!bVar69 * auVar93._8_4_;
          bVar69 = (bool)((byte)(uVar68 >> 3) & 1);
          uVar133 = (uint)bVar69 * auVar90._12_4_ | (uint)!bVar69 * auVar93._12_4_;
          bVar69 = (bool)((byte)(uVar68 >> 4) & 1);
          uVar134 = (uint)bVar69 * auVar90._16_4_ | (uint)!bVar69 * auVar93._16_4_;
          bVar69 = (bool)((byte)(uVar68 >> 5) & 1);
          uVar135 = (uint)bVar69 * auVar90._20_4_ | (uint)!bVar69 * auVar93._20_4_;
          bVar69 = (bool)((byte)(uVar68 >> 6) & 1);
          uVar136 = (uint)bVar69 * auVar90._24_4_ | (uint)!bVar69 * auVar93._24_4_;
          bVar69 = SUB81(uVar68 >> 7,0);
          uVar137 = (uint)bVar69 * auVar90._28_4_ | (uint)!bVar69 * auVar93._28_4_;
          auVar122._0_4_ = (bVar65 & 1) * uVar71 | !(bool)(bVar65 & 1) * auVar122._0_4_;
          bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar122._4_4_ = bVar69 * uVar131 | !bVar69 * auVar122._4_4_;
          bVar69 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar122._8_4_ = bVar69 * uVar132 | !bVar69 * auVar122._8_4_;
          bVar69 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar122._12_4_ = bVar69 * uVar133 | !bVar69 * auVar122._12_4_;
          bVar69 = (bool)((byte)(uVar70 >> 4) & 1);
          auVar122._16_4_ = bVar69 * uVar134 | !bVar69 * auVar122._16_4_;
          bVar69 = (bool)((byte)(uVar70 >> 5) & 1);
          auVar122._20_4_ = bVar69 * uVar135 | !bVar69 * auVar122._20_4_;
          bVar69 = (bool)((byte)(uVar70 >> 6) & 1);
          auVar122._24_4_ = bVar69 * uVar136 | !bVar69 * auVar122._24_4_;
          bVar69 = SUB81(uVar70 >> 7,0);
          auVar122._28_4_ = bVar69 * uVar137 | !bVar69 * auVar122._28_4_;
          auVar90 = vblendmps_avx512vl(auVar251,auVar239);
          bVar69 = (bool)((byte)(uVar68 >> 1) & 1);
          bVar5 = (bool)((byte)(uVar68 >> 2) & 1);
          bVar6 = (bool)((byte)(uVar68 >> 3) & 1);
          bVar7 = (bool)((byte)(uVar68 >> 4) & 1);
          bVar8 = (bool)((byte)(uVar68 >> 5) & 1);
          bVar9 = (bool)((byte)(uVar68 >> 6) & 1);
          bVar10 = SUB81(uVar68 >> 7,0);
          auVar123._0_4_ =
               (uint)(bVar65 & 1) *
               ((uint)(bVar63 & 1) * auVar90._0_4_ | !(bool)(bVar63 & 1) * uVar71) |
               !(bool)(bVar65 & 1) * auVar123._0_4_;
          bVar4 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar123._4_4_ =
               (uint)bVar4 * ((uint)bVar69 * auVar90._4_4_ | !bVar69 * uVar131) |
               !bVar4 * auVar123._4_4_;
          bVar69 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar123._8_4_ =
               (uint)bVar69 * ((uint)bVar5 * auVar90._8_4_ | !bVar5 * uVar132) |
               !bVar69 * auVar123._8_4_;
          bVar69 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar123._12_4_ =
               (uint)bVar69 * ((uint)bVar6 * auVar90._12_4_ | !bVar6 * uVar133) |
               !bVar69 * auVar123._12_4_;
          bVar69 = (bool)((byte)(uVar70 >> 4) & 1);
          auVar123._16_4_ =
               (uint)bVar69 * ((uint)bVar7 * auVar90._16_4_ | !bVar7 * uVar134) |
               !bVar69 * auVar123._16_4_;
          bVar69 = (bool)((byte)(uVar70 >> 5) & 1);
          auVar123._20_4_ =
               (uint)bVar69 * ((uint)bVar8 * auVar90._20_4_ | !bVar8 * uVar135) |
               !bVar69 * auVar123._20_4_;
          bVar69 = (bool)((byte)(uVar70 >> 6) & 1);
          auVar123._24_4_ =
               (uint)bVar69 * ((uint)bVar9 * auVar90._24_4_ | !bVar9 * uVar136) |
               !bVar69 * auVar123._24_4_;
          bVar69 = SUB81(uVar70 >> 7,0);
          auVar123._28_4_ =
               (uint)bVar69 * ((uint)bVar10 * auVar90._28_4_ | !bVar10 * uVar137) |
               !bVar69 * auVar123._28_4_;
          bVar67 = (~bVar65 | bVar63) & bVar67;
        }
      }
      auVar240._0_4_ = local_4a0._0_4_ * auVar235._0_4_;
      auVar240._4_4_ = local_4a0._4_4_ * auVar235._4_4_;
      auVar240._8_4_ = local_4a0._8_4_ * auVar235._8_4_;
      auVar240._12_4_ = local_4a0._12_4_ * auVar235._12_4_;
      auVar240._16_4_ = local_4a0._16_4_ * auVar235._16_4_;
      auVar240._20_4_ = local_4a0._20_4_ * auVar235._20_4_;
      auVar240._28_36_ = auVar235._28_36_;
      auVar240._24_4_ = local_4a0._24_4_ * auVar235._24_4_;
      auVar74 = vfmadd231ps_fma(auVar240._0_32_,local_480,auVar92);
      auVar240 = ZEXT3264(local_460);
      auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),local_460,auVar83);
      auVar234._8_4_ = 0x7fffffff;
      auVar234._0_8_ = 0x7fffffff7fffffff;
      auVar234._12_4_ = 0x7fffffff;
      auVar234._16_4_ = 0x7fffffff;
      auVar234._20_4_ = 0x7fffffff;
      auVar234._24_4_ = 0x7fffffff;
      auVar234._28_4_ = 0x7fffffff;
      auVar235 = ZEXT3264(auVar234);
      auVar90 = vandps_avx(ZEXT1632(auVar74),auVar234);
      auVar246 = ZEXT3264(local_8a0);
      _local_1c0 = local_8a0;
      auVar227._8_4_ = 0x3e99999a;
      auVar227._0_8_ = 0x3e99999a3e99999a;
      auVar227._12_4_ = 0x3e99999a;
      auVar227._16_4_ = 0x3e99999a;
      auVar227._20_4_ = 0x3e99999a;
      auVar227._24_4_ = 0x3e99999a;
      auVar227._28_4_ = 0x3e99999a;
      uVar12 = vcmpps_avx512vl(auVar90,auVar227,1);
      _local_3a0 = vmaxps_avx(local_8a0,auVar123);
      auVar90 = vminps_avx(local_380,auVar122);
      uVar14 = vcmpps_avx512vl(local_8a0,auVar90,2);
      bVar65 = (byte)uVar14 & bVar62;
      _local_420 = _local_3a0;
      uVar13 = vcmpps_avx512vl(_local_3a0,local_380,2);
      if ((bVar62 & ((byte)uVar13 | (byte)uVar14)) == 0) {
        auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      }
      else {
        auVar258 = ZEXT3264(local_8a0);
        local_8b0 = (uint)(byte)((byte)uVar12 | ~bVar67);
        auVar55._4_4_ = local_4a0._4_4_ * auVar244._4_4_;
        auVar55._0_4_ = local_4a0._0_4_ * auVar244._0_4_;
        auVar55._8_4_ = local_4a0._8_4_ * auVar244._8_4_;
        auVar55._12_4_ = local_4a0._12_4_ * auVar244._12_4_;
        auVar55._16_4_ = local_4a0._16_4_ * auVar244._16_4_;
        auVar55._20_4_ = local_4a0._20_4_ * auVar244._20_4_;
        auVar55._24_4_ = local_4a0._24_4_ * auVar244._24_4_;
        auVar55._28_4_ = auVar90._28_4_;
        auVar74 = vfmadd213ps_fma(auVar96,local_480,auVar55);
        auVar74 = vfmadd213ps_fma(auVar91,local_460,ZEXT1632(auVar74));
        auVar90 = vandps_avx(ZEXT1632(auVar74),auVar234);
        uVar12 = vcmpps_avx512vl(auVar90,auVar227,1);
        bVar67 = (byte)uVar12 | ~bVar67;
        auVar149._8_4_ = 2;
        auVar149._0_8_ = 0x200000002;
        auVar149._12_4_ = 2;
        auVar149._16_4_ = 2;
        auVar149._20_4_ = 2;
        auVar149._24_4_ = 2;
        auVar149._28_4_ = 2;
        auVar29._8_4_ = 3;
        auVar29._0_8_ = 0x300000003;
        auVar29._12_4_ = 3;
        auVar29._16_4_ = 3;
        auVar29._20_4_ = 3;
        auVar29._24_4_ = 3;
        auVar29._28_4_ = 3;
        auVar90 = vpblendmd_avx512vl(auVar149,auVar29);
        local_360._0_4_ = (uint)(bVar67 & 1) * auVar90._0_4_ | (uint)!(bool)(bVar67 & 1) * 2;
        bVar69 = (bool)(bVar67 >> 1 & 1);
        local_360._4_4_ = (uint)bVar69 * auVar90._4_4_ | (uint)!bVar69 * 2;
        bVar69 = (bool)(bVar67 >> 2 & 1);
        local_360._8_4_ = (uint)bVar69 * auVar90._8_4_ | (uint)!bVar69 * 2;
        bVar69 = (bool)(bVar67 >> 3 & 1);
        local_360._12_4_ = (uint)bVar69 * auVar90._12_4_ | (uint)!bVar69 * 2;
        bVar69 = (bool)(bVar67 >> 4 & 1);
        local_360._16_4_ = (uint)bVar69 * auVar90._16_4_ | (uint)!bVar69 * 2;
        bVar69 = (bool)(bVar67 >> 5 & 1);
        local_360._20_4_ = (uint)bVar69 * auVar90._20_4_ | (uint)!bVar69 * 2;
        bVar69 = (bool)(bVar67 >> 6 & 1);
        local_360._24_4_ = (uint)bVar69 * auVar90._24_4_ | (uint)!bVar69 * 2;
        local_360._28_4_ = (uint)(bVar67 >> 7) * auVar90._28_4_ | (uint)!(bool)(bVar67 >> 7) * 2;
        local_3c0 = vpbroadcastd_avx512vl();
        uVar12 = vpcmpd_avx512vl(local_3c0,local_360,5);
        local_8ac = (uint)bVar65;
        local_400 = local_8a0._0_4_ + (float)local_440._0_4_;
        fStack_3fc = local_8a0._4_4_ + (float)local_440._4_4_;
        fStack_3f8 = local_8a0._8_4_ + fStack_438;
        fStack_3f4 = local_8a0._12_4_ + fStack_434;
        fStack_3f0 = local_8a0._16_4_ + fStack_430;
        fStack_3ec = local_8a0._20_4_ + fStack_42c;
        fStack_3e8 = local_8a0._24_4_ + fStack_428;
        fStack_3e4 = local_8a0._28_4_ + fStack_424;
        for (bVar65 = (byte)uVar12 & bVar65; bVar65 != 0; bVar65 = ~bVar67 & bVar65 & (byte)uVar12)
        {
          auVar150._8_4_ = 0x7f800000;
          auVar150._0_8_ = 0x7f8000007f800000;
          auVar150._12_4_ = 0x7f800000;
          auVar150._16_4_ = 0x7f800000;
          auVar150._20_4_ = 0x7f800000;
          auVar150._24_4_ = 0x7f800000;
          auVar150._28_4_ = 0x7f800000;
          auVar90 = vblendmps_avx512vl(auVar150,auVar258._0_32_);
          auVar124._0_4_ =
               (uint)(bVar65 & 1) * auVar90._0_4_ | (uint)!(bool)(bVar65 & 1) * 0x7f800000;
          bVar69 = (bool)(bVar65 >> 1 & 1);
          auVar124._4_4_ = (uint)bVar69 * auVar90._4_4_ | (uint)!bVar69 * 0x7f800000;
          bVar69 = (bool)(bVar65 >> 2 & 1);
          auVar124._8_4_ = (uint)bVar69 * auVar90._8_4_ | (uint)!bVar69 * 0x7f800000;
          bVar69 = (bool)(bVar65 >> 3 & 1);
          auVar124._12_4_ = (uint)bVar69 * auVar90._12_4_ | (uint)!bVar69 * 0x7f800000;
          bVar69 = (bool)(bVar65 >> 4 & 1);
          auVar124._16_4_ = (uint)bVar69 * auVar90._16_4_ | (uint)!bVar69 * 0x7f800000;
          bVar69 = (bool)(bVar65 >> 5 & 1);
          auVar124._20_4_ = (uint)bVar69 * auVar90._20_4_ | (uint)!bVar69 * 0x7f800000;
          auVar124._24_4_ =
               (uint)(bVar65 >> 6) * auVar90._24_4_ | (uint)!(bool)(bVar65 >> 6) * 0x7f800000;
          auVar124._28_4_ = 0x7f800000;
          auVar90 = vshufps_avx(auVar124,auVar124,0xb1);
          auVar90 = vminps_avx(auVar124,auVar90);
          auVar91 = vshufpd_avx(auVar90,auVar90,5);
          auVar90 = vminps_avx(auVar90,auVar91);
          auVar91 = vpermpd_avx2(auVar90,0x4e);
          auVar90 = vminps_avx(auVar90,auVar91);
          uVar12 = vcmpps_avx512vl(auVar124,auVar90,0);
          bVar63 = (byte)uVar12 & bVar65;
          bVar67 = bVar65;
          if (bVar63 != 0) {
            bVar67 = bVar63;
          }
          iVar15 = 0;
          for (uVar71 = (uint)bVar67; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
            iVar15 = iVar15 + 1;
          }
          bVar67 = '\x01' << ((byte)iVar15 & 0x1f);
          uVar71 = *(uint *)(local_1e0 + (uint)(iVar15 << 2));
          auVar235 = ZEXT464(*(uint *)(local_1c0 + (uint)(iVar15 << 2)));
          fVar214 = local_8a8;
          if ((float)local_720._0_4_ < 0.0) {
            local_800._0_16_ = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar15 << 2)));
            auVar240 = ZEXT1664(auVar240._0_16_);
            auVar244 = ZEXT1664(auVar244._0_16_);
            auVar246 = ZEXT1664(auVar246._0_16_);
            fVar214 = sqrtf((float)local_720._0_4_);
            auVar235 = ZEXT1664(local_800._0_16_);
            auVar257 = ZEXT3264(local_880);
            auVar256 = ZEXT3264(local_860);
            auVar255 = ZEXT3264(local_840);
            auVar254 = ZEXT3264(local_820);
          }
          uVar70 = (ulong)bVar67;
          auVar75 = vminps_avx(local_6a0._0_16_,local_6e0._0_16_);
          auVar74 = vmaxps_avx(local_6a0._0_16_,local_6e0._0_16_);
          auVar72 = vminps_avx(local_6c0._0_16_,local_700._0_16_);
          auVar1 = vminps_avx(auVar75,auVar72);
          auVar75 = vmaxps_avx(local_6c0._0_16_,local_700._0_16_);
          auVar72 = vmaxps_avx(auVar74,auVar75);
          auVar194._8_4_ = 0x7fffffff;
          auVar194._0_8_ = 0x7fffffff7fffffff;
          auVar194._12_4_ = 0x7fffffff;
          auVar74 = vandps_avx(auVar1,auVar194);
          auVar75 = vandps_avx(auVar72,auVar194);
          auVar74 = vmaxps_avx(auVar74,auVar75);
          auVar75 = vmovshdup_avx(auVar74);
          auVar75 = vmaxss_avx(auVar75,auVar74);
          auVar74 = vshufpd_avx(auVar74,auVar74,1);
          auVar74 = vmaxss_avx(auVar74,auVar75);
          fVar193 = auVar74._0_4_ * 1.9073486e-06;
          local_640 = vshufps_avx(auVar72,auVar72,0xff);
          auVar74 = vinsertps_avx(auVar235._0_16_,ZEXT416(uVar71),0x10);
          uVar68 = 0;
          while( true ) {
            bVar63 = (byte)uVar70;
            if (uVar68 == 5) break;
            uVar155 = auVar74._0_4_;
            auVar140._4_4_ = uVar155;
            auVar140._0_4_ = uVar155;
            auVar140._8_4_ = uVar155;
            auVar140._12_4_ = uVar155;
            auVar75 = vfmadd132ps_fma(auVar140,ZEXT816(0) << 0x40,local_710);
            auVar72 = vmovshdup_avx(auVar74);
            fVar228 = auVar72._0_4_;
            fVar192 = 1.0 - fVar228;
            fVar209 = fVar228 * fVar228;
            auVar78 = SUB6416(ZEXT464(0x40400000),0);
            auVar77 = SUB6416(ZEXT464(0xc0a00000),0);
            auVar76 = vfmadd213ss_fma(auVar78,auVar72,auVar77);
            auVar1 = vfmadd213ss_fma(auVar76,ZEXT416((uint)fVar209),SUB6416(ZEXT464(0x40000000),0));
            auVar73 = vfmadd213ss_fma(auVar78,ZEXT416((uint)fVar192),auVar77);
            auVar73 = vfmadd213ss_fma(auVar73,ZEXT416((uint)(fVar192 * fVar192)),
                                      SUB6416(ZEXT464(0x40000000),0));
            fVar210 = fVar192 * fVar192 * -fVar228 * 0.5;
            fVar211 = auVar1._0_4_ * 0.5;
            fVar212 = auVar73._0_4_ * 0.5;
            fVar213 = fVar228 * fVar228 * -fVar192 * 0.5;
            auVar195._0_4_ = fVar213 * (float)local_700._0_4_;
            auVar195._4_4_ = fVar213 * (float)local_700._4_4_;
            auVar195._8_4_ = fVar213 * fStack_6f8;
            auVar195._12_4_ = fVar213 * fStack_6f4;
            auVar215._4_4_ = fVar212;
            auVar215._0_4_ = fVar212;
            auVar215._8_4_ = fVar212;
            auVar215._12_4_ = fVar212;
            auVar1 = vfmadd132ps_fma(auVar215,auVar195,local_6c0._0_16_);
            auVar173._4_4_ = fVar211;
            auVar173._0_4_ = fVar211;
            auVar173._8_4_ = fVar211;
            auVar173._12_4_ = fVar211;
            auVar1 = vfmadd132ps_fma(auVar173,auVar1,local_6e0._0_16_);
            auVar196._4_4_ = fVar210;
            auVar196._0_4_ = fVar210;
            auVar196._8_4_ = fVar210;
            auVar196._12_4_ = fVar210;
            auVar1 = vfmadd132ps_fma(auVar196,auVar1,local_6a0._0_16_);
            auVar73 = vfmadd231ss_fma(auVar77,auVar72,ZEXT416(0x41100000));
            local_5c0._0_16_ = auVar73;
            auVar73 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar72,ZEXT416(0x40800000));
            local_5e0._0_16_ = auVar73;
            auVar73 = vfmadd213ss_fma(auVar78,auVar72,ZEXT416(0xbf800000));
            local_600._0_16_ = auVar73;
            _local_5a0 = auVar1;
            auVar1 = vsubps_avx(auVar75,auVar1);
            auVar75 = vdpps_avx(auVar1,auVar1,0x7f);
            local_800._0_16_ = auVar75;
            local_680._0_16_ = auVar74;
            if (auVar75._0_4_ < 0.0) {
              local_7c0._0_4_ = auVar76._0_4_;
              local_7e0._0_16_ = ZEXT416((uint)fVar192);
              local_740._0_4_ = fVar209;
              local_760._0_4_ = fVar192 * -2.0;
              auVar244._0_4_ = sqrtf(auVar75._0_4_);
              auVar244._4_60_ = extraout_var;
              auVar76 = ZEXT416((uint)local_7c0._0_4_);
              auVar74 = auVar244._0_16_;
              uVar70 = extraout_RAX;
              auVar75 = local_7e0._0_16_;
            }
            else {
              auVar74 = vsqrtss_avx(auVar75,auVar75);
              local_760._0_4_ = fVar192 * -2.0;
              local_740._0_4_ = fVar209;
              auVar75 = ZEXT416((uint)fVar192);
            }
            fVar209 = auVar75._0_4_;
            auVar77 = vfnmadd231ss_fma(ZEXT416((uint)(fVar228 * (fVar209 + fVar209))),auVar75,
                                       auVar75);
            auVar75 = vfmadd213ss_fma(auVar76,ZEXT416((uint)(fVar228 + fVar228)),
                                      ZEXT416((uint)(fVar228 * fVar228 * 3.0)));
            auVar76 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar72,
                                      SUB6416(ZEXT464(0x40000000),0));
            auVar73 = vfmadd231ss_fma(ZEXT416((uint)(fVar209 * fVar209 * -3.0)),
                                      ZEXT416((uint)(fVar209 + fVar209)),auVar76);
            auVar76 = vfmadd213ss_fma(ZEXT416((uint)local_760._0_4_),auVar72,
                                      ZEXT416((uint)local_740._0_4_));
            fVar209 = auVar77._0_4_ * 0.5;
            fVar210 = auVar75._0_4_ * 0.5;
            fVar211 = auVar73._0_4_ * 0.5;
            fVar212 = auVar76._0_4_ * 0.5;
            auVar197._0_4_ = fVar212 * (float)local_700._0_4_;
            auVar197._4_4_ = fVar212 * (float)local_700._4_4_;
            auVar197._8_4_ = fVar212 * fStack_6f8;
            auVar197._12_4_ = fVar212 * fStack_6f4;
            auVar174._4_4_ = fVar211;
            auVar174._0_4_ = fVar211;
            auVar174._8_4_ = fVar211;
            auVar174._12_4_ = fVar211;
            auVar75 = vfmadd132ps_fma(auVar174,auVar197,local_6c0._0_16_);
            auVar156._4_4_ = fVar210;
            auVar156._0_4_ = fVar210;
            auVar156._8_4_ = fVar210;
            auVar156._12_4_ = fVar210;
            auVar75 = vfmadd132ps_fma(auVar156,auVar75,local_6e0._0_16_);
            auVar248._4_4_ = fVar209;
            auVar248._0_4_ = fVar209;
            auVar248._8_4_ = fVar209;
            auVar248._12_4_ = fVar209;
            local_7c0._0_16_ = vfmadd132ps_fma(auVar248,auVar75,local_6a0._0_16_);
            local_740._0_16_ = vdpps_avx(local_7c0._0_16_,local_7c0._0_16_,0x7f);
            auVar57._12_4_ = 0;
            auVar57._0_12_ = ZEXT812(0);
            fVar209 = local_740._0_4_;
            auVar75 = vrsqrt14ss_avx512f(auVar57 << 0x20,ZEXT416((uint)fVar209));
            fVar210 = auVar75._0_4_;
            local_760._0_16_ = vrcp14ss_avx512f(auVar57 << 0x20,ZEXT416((uint)fVar209));
            auVar17._8_4_ = 0x80000000;
            auVar17._0_8_ = 0x8000000080000000;
            auVar17._12_4_ = 0x80000000;
            auVar76 = vxorps_avx512vl(local_740._0_16_,auVar17);
            auVar75 = vfnmadd213ss_fma(local_760._0_16_,local_740._0_16_,
                                       SUB6416(ZEXT464(0x40000000),0));
            local_7e0._0_4_ = auVar74._0_4_;
            if (fVar209 < auVar76._0_4_) {
              fVar211 = sqrtf(fVar209);
              auVar74 = ZEXT416((uint)local_7e0._0_4_);
              uVar70 = extraout_RAX_00;
              auVar76 = local_7c0._0_16_;
            }
            else {
              auVar76 = vsqrtss_avx(local_740._0_16_,local_740._0_16_);
              fVar211 = auVar76._0_4_;
              auVar76 = local_7c0._0_16_;
            }
            fVar209 = fVar210 * 1.5 + fVar209 * -0.5 * fVar210 * fVar210 * fVar210;
            auVar141._0_4_ = auVar76._0_4_ * fVar209;
            auVar141._4_4_ = auVar76._4_4_ * fVar209;
            auVar141._8_4_ = auVar76._8_4_ * fVar209;
            auVar141._12_4_ = auVar76._12_4_ * fVar209;
            auVar73 = vdpps_avx(auVar1,auVar141,0x7f);
            fVar213 = auVar74._0_4_;
            fVar210 = auVar73._0_4_;
            auVar142._0_4_ = fVar210 * fVar210;
            auVar142._4_4_ = auVar73._4_4_ * auVar73._4_4_;
            auVar142._8_4_ = auVar73._8_4_ * auVar73._8_4_;
            auVar142._12_4_ = auVar73._12_4_ * auVar73._12_4_;
            auVar77 = vsubps_avx512vl(local_800._0_16_,auVar142);
            fVar212 = auVar77._0_4_;
            auVar157._4_12_ = ZEXT812(0) << 0x20;
            auVar157._0_4_ = fVar212;
            auVar78 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar157);
            auVar79 = vmulss_avx512f(auVar77,ZEXT416(0xbf000000));
            if (fVar212 < 0.0) {
              local_630 = fVar209;
              fStack_62c = fVar209;
              fStack_628 = fVar209;
              fStack_624 = fVar209;
              local_620 = auVar78;
              fVar212 = sqrtf(fVar212);
              auVar79 = ZEXT416(auVar79._0_4_);
              auVar74 = ZEXT416((uint)local_7e0._0_4_);
              uVar70 = extraout_RAX_01;
              auVar77 = local_620;
              auVar76 = local_7c0._0_16_;
              fVar209 = local_630;
              fVar192 = fStack_62c;
              fVar228 = fStack_628;
              fVar229 = fStack_624;
            }
            else {
              auVar77 = vsqrtss_avx(auVar77,auVar77);
              fVar212 = auVar77._0_4_;
              auVar77 = auVar78;
              fVar192 = fVar209;
              fVar228 = fVar209;
              fVar229 = fVar209;
            }
            auVar244 = ZEXT1664(auVar1);
            auVar254 = ZEXT3264(local_820);
            auVar255 = ZEXT3264(local_840);
            auVar256 = ZEXT3264(local_860);
            auVar257 = ZEXT3264(local_880);
            auVar158._0_4_ = (float)local_600._0_4_ * (float)local_700._0_4_;
            auVar158._4_4_ = (float)local_600._0_4_ * (float)local_700._4_4_;
            auVar158._8_4_ = (float)local_600._0_4_ * fStack_6f8;
            auVar158._12_4_ = (float)local_600._0_4_ * fStack_6f4;
            auVar175._4_4_ = local_5e0._0_4_;
            auVar175._0_4_ = local_5e0._0_4_;
            auVar175._8_4_ = local_5e0._0_4_;
            auVar175._12_4_ = local_5e0._0_4_;
            auVar11 = vfmadd132ps_fma(auVar175,auVar158,local_6c0._0_16_);
            auVar159._4_4_ = local_5c0._0_4_;
            auVar159._0_4_ = local_5c0._0_4_;
            auVar159._8_4_ = local_5c0._0_4_;
            auVar159._12_4_ = local_5c0._0_4_;
            auVar11 = vfmadd132ps_fma(auVar159,auVar11,local_6e0._0_16_);
            auVar72 = vfmadd213ss_fma(auVar72,SUB6416(ZEXT464(0xc0400000),0),ZEXT416(0x40000000));
            uVar155 = auVar72._0_4_;
            auVar176._4_4_ = uVar155;
            auVar176._0_4_ = uVar155;
            auVar176._8_4_ = uVar155;
            auVar176._12_4_ = uVar155;
            auVar72 = vfmadd132ps_fma(auVar176,auVar11,local_6a0._0_16_);
            auVar160._0_4_ = auVar72._0_4_ * (float)local_740._0_4_;
            auVar160._4_4_ = auVar72._4_4_ * (float)local_740._0_4_;
            auVar160._8_4_ = auVar72._8_4_ * (float)local_740._0_4_;
            auVar160._12_4_ = auVar72._12_4_ * (float)local_740._0_4_;
            auVar72 = vdpps_avx(auVar76,auVar72,0x7f);
            fVar172 = auVar72._0_4_;
            auVar177._0_4_ = auVar76._0_4_ * fVar172;
            auVar177._4_4_ = auVar76._4_4_ * fVar172;
            auVar177._8_4_ = auVar76._8_4_ * fVar172;
            auVar177._12_4_ = auVar76._12_4_ * fVar172;
            auVar72 = vsubps_avx(auVar160,auVar177);
            fVar172 = auVar75._0_4_ * (float)local_760._0_4_;
            auVar11 = vmaxss_avx(ZEXT416((uint)fVar193),
                                 ZEXT416((uint)(local_680._0_4_ * fVar214 * 1.9073486e-06)));
            auVar18._8_4_ = 0x80000000;
            auVar18._0_8_ = 0x8000000080000000;
            auVar18._12_4_ = 0x80000000;
            auVar126._16_16_ = local_880._16_16_;
            auVar80 = vxorps_avx512vl(auVar76,auVar18);
            auVar178._0_4_ = fVar209 * auVar72._0_4_ * fVar172;
            auVar178._4_4_ = fVar192 * auVar72._4_4_ * fVar172;
            auVar178._8_4_ = fVar228 * auVar72._8_4_ * fVar172;
            auVar178._12_4_ = fVar229 * auVar72._12_4_ * fVar172;
            auVar246 = ZEXT1664(auVar141);
            auVar75 = vdpps_avx(auVar80,auVar141,0x7f);
            auVar72 = vfmadd213ss_fma(auVar74,ZEXT416((uint)fVar193),auVar11);
            auVar74 = vdpps_avx(auVar1,auVar178,0x7f);
            auVar220 = vfmadd213ss_fma(ZEXT416((uint)(fVar213 + 1.0)),
                                       ZEXT416((uint)(fVar193 / fVar211)),auVar72);
            fVar209 = auVar75._0_4_ + auVar74._0_4_;
            auVar74 = vdpps_avx(local_710,auVar141,0x7f);
            auVar75 = vdpps_avx(auVar1,auVar80,0x7f);
            auVar72 = vmulss_avx512f(auVar79,auVar77);
            fVar211 = auVar78._0_4_ * 1.5 + auVar72._0_4_ * auVar77._0_4_ * auVar77._0_4_;
            auVar72 = vdpps_avx(auVar1,local_710,0x7f);
            auVar78 = vfnmadd231ss_fma(auVar75,auVar73,ZEXT416((uint)fVar209));
            auVar72 = vfnmadd231ss_fma(auVar72,auVar73,auVar74);
            auVar75 = vpermilps_avx(_local_5a0,0xff);
            fVar212 = fVar212 - auVar75._0_4_;
            auVar77 = vshufps_avx(auVar76,auVar76,0xff);
            auVar75 = vfmsub213ss_fma(auVar78,ZEXT416((uint)fVar211),auVar77);
            auVar237._8_4_ = 0x80000000;
            auVar237._0_8_ = 0x8000000080000000;
            auVar237._12_4_ = 0x80000000;
            auVar240 = ZEXT1664(auVar237);
            auVar232._0_8_ = auVar75._0_8_ ^ 0x8000000080000000;
            auVar232._8_4_ = auVar75._8_4_ ^ 0x80000000;
            auVar232._12_4_ = auVar75._12_4_ ^ 0x80000000;
            auVar235 = ZEXT1664(auVar232);
            auVar72 = ZEXT416((uint)(auVar72._0_4_ * fVar211));
            auVar78 = vfmsub231ss_fma(ZEXT416((uint)(auVar74._0_4_ * auVar75._0_4_)),
                                      ZEXT416((uint)fVar209),auVar72);
            auVar75 = vinsertps_avx(auVar232,auVar72,0x1c);
            auVar221._0_8_ = auVar74._0_8_ ^ 0x8000000080000000;
            auVar221._8_4_ = auVar74._8_4_ ^ 0x80000000;
            auVar221._12_4_ = auVar74._12_4_ ^ 0x80000000;
            auVar72 = vinsertps_avx(ZEXT416((uint)fVar209),auVar221,0x10);
            auVar198._0_4_ = auVar78._0_4_;
            auVar198._4_4_ = auVar198._0_4_;
            auVar198._8_4_ = auVar198._0_4_;
            auVar198._12_4_ = auVar198._0_4_;
            auVar74 = vdivps_avx(auVar75,auVar198);
            auVar75 = vdivps_avx(auVar72,auVar198);
            auVar199._0_4_ = fVar210 * auVar74._0_4_ + fVar212 * auVar75._0_4_;
            auVar199._4_4_ = fVar210 * auVar74._4_4_ + fVar212 * auVar75._4_4_;
            auVar199._8_4_ = fVar210 * auVar74._8_4_ + fVar212 * auVar75._8_4_;
            auVar199._12_4_ = fVar210 * auVar74._12_4_ + fVar212 * auVar75._12_4_;
            auVar74 = vsubps_avx(local_680._0_16_,auVar199);
            auVar19._8_4_ = 0x7fffffff;
            auVar19._0_8_ = 0x7fffffff7fffffff;
            auVar19._12_4_ = 0x7fffffff;
            auVar75 = vandps_avx512vl(auVar73,auVar19);
            if (auVar75._0_4_ < auVar220._0_4_) {
              auVar75 = vfmadd231ss_fma(ZEXT416((uint)(auVar220._0_4_ + auVar11._0_4_)),local_640,
                                        ZEXT416(0x36000000));
              auVar20._8_4_ = 0x7fffffff;
              auVar20._0_8_ = 0x7fffffff7fffffff;
              auVar20._12_4_ = 0x7fffffff;
              auVar72 = vandps_avx512vl(ZEXT416((uint)fVar212),auVar20);
              if (auVar72._0_4_ < auVar75._0_4_) {
                bVar69 = uVar68 < 5;
                fVar214 = auVar74._0_4_ + (float)local_650._0_4_;
                if ((fVar138 <= fVar214) &&
                   (fVar193 = *(float *)(ray + k * 4 + 0x80), fVar214 <= fVar193)) {
                  auVar75 = vmovshdup_avx(auVar74);
                  bVar63 = 0;
                  if ((auVar75._0_4_ < 0.0) || (1.0 < auVar75._0_4_)) goto LAB_01a41465;
                  auVar200._0_12_ = ZEXT812(0);
                  auVar200._12_4_ = 0;
                  auVar126._0_16_ = auVar200;
                  auVar125._4_28_ = auVar126._4_28_;
                  auVar125._0_4_ = local_800._0_4_;
                  auVar75 = vrsqrt14ss_avx512f(auVar200,auVar125._0_16_);
                  fVar209 = auVar75._0_4_;
                  auVar75 = vmulss_avx512f(local_800._0_16_,ZEXT416(0xbf000000));
                  pGVar2 = (context->scene->geometries).items[local_8b8].ptr;
                  if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar63 = 1, pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_01a41465;
                    fVar209 = fVar209 * 1.5 + auVar75._0_4_ * fVar209 * fVar209 * fVar209;
                    auVar179._0_4_ = auVar1._0_4_ * fVar209;
                    auVar179._4_4_ = auVar1._4_4_ * fVar209;
                    auVar179._8_4_ = auVar1._8_4_ * fVar209;
                    auVar179._12_4_ = auVar1._12_4_ * fVar209;
                    auVar73 = vfmadd213ps_fma(auVar77,auVar179,auVar76);
                    auVar75 = vshufps_avx(auVar179,auVar179,0xc9);
                    auVar72 = vshufps_avx(auVar76,auVar76,0xc9);
                    auVar180._0_4_ = auVar179._0_4_ * auVar72._0_4_;
                    auVar180._4_4_ = auVar179._4_4_ * auVar72._4_4_;
                    auVar180._8_4_ = auVar179._8_4_ * auVar72._8_4_;
                    auVar180._12_4_ = auVar179._12_4_ * auVar72._12_4_;
                    auVar76 = vfmsub231ps_fma(auVar180,auVar76,auVar75);
                    auVar75 = vshufps_avx(auVar76,auVar76,0xc9);
                    auVar72 = vshufps_avx(auVar73,auVar73,0xc9);
                    auVar76 = vshufps_avx(auVar76,auVar76,0xd2);
                    auVar143._0_4_ = auVar73._0_4_ * auVar76._0_4_;
                    auVar143._4_4_ = auVar73._4_4_ * auVar76._4_4_;
                    auVar143._8_4_ = auVar73._8_4_ * auVar76._8_4_;
                    auVar143._12_4_ = auVar73._12_4_ * auVar76._12_4_;
                    auVar75 = vfmsub231ps_fma(auVar143,auVar75,auVar72);
                    local_510 = vshufps_avx(auVar74,auVar74,0x55);
                    local_540 = (RTCHitN  [16])vshufps_avx(auVar75,auVar75,0x55);
                    auStack_530 = vshufps_avx(auVar75,auVar75,0xaa);
                    local_520 = auVar75._0_4_;
                    uStack_51c = local_520;
                    uStack_518 = local_520;
                    uStack_514 = local_520;
                    local_500 = ZEXT416(0) << 0x20;
                    local_4f0 = local_550._0_8_;
                    uStack_4e8 = local_550._8_8_;
                    local_4e0 = local_560;
                    vpcmpeqd_avx2(ZEXT1632(local_560),ZEXT1632(local_560));
                    uStack_4cc = context->user->instID[0];
                    local_4d0 = uStack_4cc;
                    uStack_4c8 = uStack_4cc;
                    uStack_4c4 = uStack_4cc;
                    uStack_4c0 = context->user->instPrimID[0];
                    uStack_4bc = uStack_4c0;
                    uStack_4b8 = uStack_4c0;
                    uStack_4b4 = uStack_4c0;
                    *(float *)(ray + k * 4 + 0x80) = fVar214;
                    local_8d0 = local_570;
                    local_790.valid = (int *)local_8d0;
                    local_790.geometryUserPtr = pGVar2->userPtr;
                    local_790.context = context->user;
                    local_790.hit = local_540;
                    local_790.N = 4;
                    local_790.ray = (RTCRayN *)ray;
                    if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar235 = ZEXT1664(auVar232);
                      auVar240 = ZEXT1664(auVar237);
                      auVar244 = ZEXT1664(auVar1);
                      auVar246 = ZEXT1664(auVar141);
                      (*pGVar2->occlusionFilterN)(&local_790);
                      auVar257 = ZEXT3264(local_880);
                      auVar256 = ZEXT3264(local_860);
                      auVar255 = ZEXT3264(local_840);
                      auVar254 = ZEXT3264(local_820);
                    }
                    uVar70 = vptestmd_avx512vl(local_8d0,local_8d0);
                    if ((uVar70 & 0xf) == 0) {
                      auVar258 = ZEXT3264(local_8a0);
                    }
                    else {
                      p_Var3 = context->args->filter;
                      if (p_Var3 == (RTCFilterFunctionN)0x0) {
                        auVar258 = ZEXT3264(local_8a0);
                      }
                      else {
                        auVar258 = ZEXT3264(local_8a0);
                        if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           (((pGVar2->field_8).field_0x2 & 0x40) != 0)) {
                          auVar235 = ZEXT1664(auVar235._0_16_);
                          auVar240 = ZEXT1664(auVar240._0_16_);
                          auVar244 = ZEXT1664(auVar244._0_16_);
                          auVar246 = ZEXT1664(auVar246._0_16_);
                          (*p_Var3)(&local_790);
                          auVar258 = ZEXT3264(local_8a0);
                          auVar257 = ZEXT3264(local_880);
                          auVar256 = ZEXT3264(local_860);
                          auVar255 = ZEXT3264(local_840);
                          auVar254 = ZEXT3264(local_820);
                        }
                      }
                      uVar70 = vptestmd_avx512vl(local_8d0,local_8d0);
                      uVar70 = uVar70 & 0xf;
                      auVar74 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      bVar4 = (bool)((byte)uVar70 & 1);
                      bVar5 = (bool)((byte)(uVar70 >> 1) & 1);
                      bVar6 = (bool)((byte)(uVar70 >> 2) & 1);
                      bVar7 = SUB81(uVar70 >> 3,0);
                      *(uint *)(local_790.ray + 0x80) =
                           (uint)bVar4 * auVar74._0_4_ |
                           (uint)!bVar4 * *(int *)(local_790.ray + 0x80);
                      *(uint *)(local_790.ray + 0x84) =
                           (uint)bVar5 * auVar74._4_4_ |
                           (uint)!bVar5 * *(int *)(local_790.ray + 0x84);
                      *(uint *)(local_790.ray + 0x88) =
                           (uint)bVar6 * auVar74._8_4_ |
                           (uint)!bVar6 * *(int *)(local_790.ray + 0x88);
                      *(uint *)(local_790.ray + 0x8c) =
                           (uint)bVar7 * auVar74._12_4_ |
                           (uint)!bVar7 * *(int *)(local_790.ray + 0x8c);
                      bVar63 = 1;
                      if ((byte)uVar70 != 0) goto LAB_01a4146e;
                    }
                    *(float *)(ray + k * 4 + 0x80) = fVar193;
                    bVar63 = 0;
                    goto LAB_01a4146e;
                  }
                }
                bVar63 = 0;
                goto LAB_01a41465;
              }
            }
            uVar68 = uVar68 + 1;
          }
          bVar69 = false;
LAB_01a41465:
          auVar258 = ZEXT3264(local_8a0);
LAB_01a4146e:
          bVar64 = bVar64 | bVar69 & bVar63;
          uVar155 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar223._4_4_ = uVar155;
          auVar223._0_4_ = uVar155;
          auVar223._8_4_ = uVar155;
          auVar223._12_4_ = uVar155;
          auVar223._16_4_ = uVar155;
          auVar223._20_4_ = uVar155;
          auVar223._24_4_ = uVar155;
          auVar223._28_4_ = uVar155;
          auVar225 = ZEXT3264(auVar223);
          auVar59._4_4_ = fStack_3fc;
          auVar59._0_4_ = local_400;
          auVar59._8_4_ = fStack_3f8;
          auVar59._12_4_ = fStack_3f4;
          auVar59._16_4_ = fStack_3f0;
          auVar59._20_4_ = fStack_3ec;
          auVar59._24_4_ = fStack_3e8;
          auVar59._28_4_ = fStack_3e4;
          uVar12 = vcmpps_avx512vl(auVar223,auVar59,0xd);
        }
        auVar151._0_4_ = (float)local_440._0_4_ + (float)local_420._0_4_;
        auVar151._4_4_ = (float)local_440._4_4_ + (float)local_420._4_4_;
        auVar151._8_4_ = fStack_438 + fStack_418;
        auVar151._12_4_ = fStack_434 + fStack_414;
        auVar151._16_4_ = fStack_430 + fStack_410;
        auVar151._20_4_ = fStack_42c + fStack_40c;
        auVar151._24_4_ = fStack_428 + fStack_408;
        auVar151._28_4_ = fStack_424 + fStack_404;
        uVar155 = auVar225._0_4_;
        auVar168._4_4_ = uVar155;
        auVar168._0_4_ = uVar155;
        auVar168._8_4_ = uVar155;
        auVar168._12_4_ = uVar155;
        auVar168._16_4_ = uVar155;
        auVar168._20_4_ = uVar155;
        auVar168._24_4_ = uVar155;
        auVar168._28_4_ = uVar155;
        uVar12 = vcmpps_avx512vl(auVar151,auVar168,2);
        auVar152._8_4_ = 2;
        auVar152._0_8_ = 0x200000002;
        auVar152._12_4_ = 2;
        auVar152._16_4_ = 2;
        auVar152._20_4_ = 2;
        auVar152._24_4_ = 2;
        auVar152._28_4_ = 2;
        auVar30._8_4_ = 3;
        auVar30._0_8_ = 0x300000003;
        auVar30._12_4_ = 3;
        auVar30._16_4_ = 3;
        auVar30._20_4_ = 3;
        auVar30._24_4_ = 3;
        auVar30._28_4_ = 3;
        auVar90 = vpblendmd_avx512vl(auVar152,auVar30);
        bVar69 = (bool)((byte)local_8b0 & 1);
        local_420._0_4_ = (uint)bVar69 * auVar90._0_4_ | (uint)!bVar69 * 2;
        bVar69 = (bool)((byte)(local_8b0 >> 1) & 1);
        local_420._4_4_ = (uint)bVar69 * auVar90._4_4_ | (uint)!bVar69 * 2;
        bVar69 = (bool)((byte)(local_8b0 >> 2) & 1);
        fStack_418 = (float)((uint)bVar69 * auVar90._8_4_ | (uint)!bVar69 * 2);
        bVar69 = (bool)((byte)(local_8b0 >> 3) & 1);
        fStack_414 = (float)((uint)bVar69 * auVar90._12_4_ | (uint)!bVar69 * 2);
        bVar69 = (bool)((byte)(local_8b0 >> 4) & 1);
        fStack_410 = (float)((uint)bVar69 * auVar90._16_4_ | (uint)!bVar69 * 2);
        bVar69 = (bool)((byte)(local_8b0 >> 5) & 1);
        fStack_40c = (float)((uint)bVar69 * auVar90._20_4_ | (uint)!bVar69 * 2);
        bVar69 = (bool)((byte)(local_8b0 >> 6) & 1);
        fStack_408 = (float)((uint)bVar69 * auVar90._24_4_ | (uint)!bVar69 * 2);
        bVar69 = (bool)((byte)(local_8b0 >> 7) & 1);
        fStack_404 = (float)((uint)bVar69 * auVar90._28_4_ | (uint)!bVar69 * 2);
        bVar62 = (byte)uVar13 & bVar62 & (byte)uVar12;
        uVar12 = vpcmpd_avx512vl(_local_420,local_3c0,2);
        local_8a0 = _local_3a0;
        local_400 = (float)local_440._0_4_ + (float)local_3a0._0_4_;
        fStack_3fc = (float)local_440._4_4_ + (float)local_3a0._4_4_;
        fStack_3f8 = fStack_438 + fStack_398;
        fStack_3f4 = fStack_434 + fStack_394;
        fStack_3f0 = fStack_430 + fStack_390;
        fStack_3ec = fStack_42c + fStack_38c;
        fStack_3e8 = fStack_428 + fStack_388;
        fStack_3e4 = fStack_424 + fStack_384;
        for (bVar67 = (byte)uVar12 & bVar62; bVar67 != 0; bVar67 = ~bVar65 & bVar67 & (byte)uVar12)
        {
          auVar153._8_4_ = 0x7f800000;
          auVar153._0_8_ = 0x7f8000007f800000;
          auVar153._12_4_ = 0x7f800000;
          auVar153._16_4_ = 0x7f800000;
          auVar153._20_4_ = 0x7f800000;
          auVar153._24_4_ = 0x7f800000;
          auVar153._28_4_ = 0x7f800000;
          auVar90 = vblendmps_avx512vl(auVar153,local_8a0);
          auVar127._0_4_ =
               (uint)(bVar67 & 1) * auVar90._0_4_ | (uint)!(bool)(bVar67 & 1) * 0x7f800000;
          bVar69 = (bool)(bVar67 >> 1 & 1);
          auVar127._4_4_ = (uint)bVar69 * auVar90._4_4_ | (uint)!bVar69 * 0x7f800000;
          bVar69 = (bool)(bVar67 >> 2 & 1);
          auVar127._8_4_ = (uint)bVar69 * auVar90._8_4_ | (uint)!bVar69 * 0x7f800000;
          bVar69 = (bool)(bVar67 >> 3 & 1);
          auVar127._12_4_ = (uint)bVar69 * auVar90._12_4_ | (uint)!bVar69 * 0x7f800000;
          bVar69 = (bool)(bVar67 >> 4 & 1);
          auVar127._16_4_ = (uint)bVar69 * auVar90._16_4_ | (uint)!bVar69 * 0x7f800000;
          bVar69 = (bool)(bVar67 >> 5 & 1);
          auVar127._20_4_ = (uint)bVar69 * auVar90._20_4_ | (uint)!bVar69 * 0x7f800000;
          auVar127._24_4_ =
               (uint)(bVar67 >> 6) * auVar90._24_4_ | (uint)!(bool)(bVar67 >> 6) * 0x7f800000;
          auVar127._28_4_ = 0x7f800000;
          auVar90 = vshufps_avx(auVar127,auVar127,0xb1);
          auVar90 = vminps_avx(auVar127,auVar90);
          auVar91 = vshufpd_avx(auVar90,auVar90,5);
          auVar90 = vminps_avx(auVar90,auVar91);
          auVar91 = vpermpd_avx2(auVar90,0x4e);
          auVar90 = vminps_avx(auVar90,auVar91);
          uVar12 = vcmpps_avx512vl(auVar127,auVar90,0);
          bVar63 = (byte)uVar12 & bVar67;
          bVar65 = bVar67;
          if (bVar63 != 0) {
            bVar65 = bVar63;
          }
          iVar15 = 0;
          for (uVar71 = (uint)bVar65; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
            iVar15 = iVar15 + 1;
          }
          bVar65 = '\x01' << ((byte)iVar15 & 0x1f);
          uVar71 = *(uint *)(local_200 + (uint)(iVar15 << 2));
          auVar235 = ZEXT464(*(uint *)(local_380 + (uint)(iVar15 << 2)));
          fVar214 = local_8a4;
          if ((float)local_720._0_4_ < 0.0) {
            local_800._0_16_ = ZEXT416(*(uint *)(local_380 + (uint)(iVar15 << 2)));
            auVar240 = ZEXT1664(auVar240._0_16_);
            auVar244 = ZEXT1664(auVar244._0_16_);
            auVar246 = ZEXT1664(auVar246._0_16_);
            fVar214 = sqrtf((float)local_720._0_4_);
            auVar235 = ZEXT1664(local_800._0_16_);
            auVar257 = ZEXT3264(local_880);
            auVar256 = ZEXT3264(local_860);
            auVar255 = ZEXT3264(local_840);
            auVar254 = ZEXT3264(local_820);
          }
          uVar70 = (ulong)bVar65;
          auVar75 = vminps_avx(local_6a0._0_16_,local_6e0._0_16_);
          auVar74 = vmaxps_avx(local_6a0._0_16_,local_6e0._0_16_);
          auVar72 = vminps_avx(local_6c0._0_16_,local_700._0_16_);
          auVar1 = vminps_avx(auVar75,auVar72);
          auVar75 = vmaxps_avx(local_6c0._0_16_,local_700._0_16_);
          auVar72 = vmaxps_avx(auVar74,auVar75);
          auVar201._8_4_ = 0x7fffffff;
          auVar201._0_8_ = 0x7fffffff7fffffff;
          auVar201._12_4_ = 0x7fffffff;
          auVar74 = vandps_avx(auVar1,auVar201);
          auVar75 = vandps_avx(auVar72,auVar201);
          auVar74 = vmaxps_avx(auVar74,auVar75);
          auVar75 = vmovshdup_avx(auVar74);
          auVar75 = vmaxss_avx(auVar75,auVar74);
          auVar74 = vshufpd_avx(auVar74,auVar74,1);
          auVar74 = vmaxss_avx(auVar74,auVar75);
          fVar193 = auVar74._0_4_ * 1.9073486e-06;
          local_640 = vshufps_avx(auVar72,auVar72,0xff);
          auVar74 = vinsertps_avx(auVar235._0_16_,ZEXT416(uVar71),0x10);
          uVar68 = 0;
          while( true ) {
            bVar63 = (byte)uVar70;
            if (uVar68 == 5) break;
            uVar155 = auVar74._0_4_;
            auVar144._4_4_ = uVar155;
            auVar144._0_4_ = uVar155;
            auVar144._8_4_ = uVar155;
            auVar144._12_4_ = uVar155;
            auVar75 = vfmadd132ps_fma(auVar144,ZEXT816(0) << 0x40,local_710);
            auVar72 = vmovshdup_avx(auVar74);
            fVar228 = auVar72._0_4_;
            fVar192 = 1.0 - fVar228;
            fVar209 = fVar228 * fVar228;
            auVar78 = SUB6416(ZEXT464(0x40400000),0);
            auVar77 = SUB6416(ZEXT464(0xc0a00000),0);
            auVar76 = vfmadd213ss_fma(auVar78,auVar72,auVar77);
            auVar1 = vfmadd213ss_fma(auVar76,ZEXT416((uint)fVar209),SUB6416(ZEXT464(0x40000000),0));
            auVar73 = vfmadd213ss_fma(auVar78,ZEXT416((uint)fVar192),auVar77);
            auVar73 = vfmadd213ss_fma(auVar73,ZEXT416((uint)(fVar192 * fVar192)),
                                      SUB6416(ZEXT464(0x40000000),0));
            fVar210 = fVar192 * fVar192 * -fVar228 * 0.5;
            fVar211 = auVar1._0_4_ * 0.5;
            fVar212 = auVar73._0_4_ * 0.5;
            fVar213 = fVar228 * fVar228 * -fVar192 * 0.5;
            auVar202._0_4_ = fVar213 * (float)local_700._0_4_;
            auVar202._4_4_ = fVar213 * (float)local_700._4_4_;
            auVar202._8_4_ = fVar213 * fStack_6f8;
            auVar202._12_4_ = fVar213 * fStack_6f4;
            auVar216._4_4_ = fVar212;
            auVar216._0_4_ = fVar212;
            auVar216._8_4_ = fVar212;
            auVar216._12_4_ = fVar212;
            auVar1 = vfmadd132ps_fma(auVar216,auVar202,local_6c0._0_16_);
            auVar181._4_4_ = fVar211;
            auVar181._0_4_ = fVar211;
            auVar181._8_4_ = fVar211;
            auVar181._12_4_ = fVar211;
            auVar1 = vfmadd132ps_fma(auVar181,auVar1,local_6e0._0_16_);
            auVar203._4_4_ = fVar210;
            auVar203._0_4_ = fVar210;
            auVar203._8_4_ = fVar210;
            auVar203._12_4_ = fVar210;
            auVar1 = vfmadd132ps_fma(auVar203,auVar1,local_6a0._0_16_);
            auVar73 = vfmadd231ss_fma(auVar77,auVar72,ZEXT416(0x41100000));
            local_5c0._0_16_ = auVar73;
            auVar73 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar72,ZEXT416(0x40800000));
            local_5e0._0_16_ = auVar73;
            auVar73 = vfmadd213ss_fma(auVar78,auVar72,ZEXT416(0xbf800000));
            local_600._0_16_ = auVar73;
            _local_5a0 = auVar1;
            auVar1 = vsubps_avx(auVar75,auVar1);
            auVar75 = vdpps_avx(auVar1,auVar1,0x7f);
            local_800._0_16_ = auVar75;
            local_680._0_16_ = auVar74;
            if (auVar75._0_4_ < 0.0) {
              local_7c0._0_4_ = auVar76._0_4_;
              local_7e0._0_16_ = ZEXT416((uint)fVar192);
              local_740._0_4_ = fVar209;
              local_760._0_4_ = fVar192 * -2.0;
              auVar246._0_4_ = sqrtf(auVar75._0_4_);
              auVar246._4_60_ = extraout_var_00;
              auVar76 = ZEXT416((uint)local_7c0._0_4_);
              auVar74 = auVar246._0_16_;
              uVar70 = extraout_RAX_02;
              auVar75 = local_7e0._0_16_;
            }
            else {
              auVar74 = vsqrtss_avx(auVar75,auVar75);
              local_760._0_4_ = fVar192 * -2.0;
              local_740._0_4_ = fVar209;
              auVar75 = ZEXT416((uint)fVar192);
            }
            fVar209 = auVar75._0_4_;
            auVar77 = vfnmadd231ss_fma(ZEXT416((uint)(fVar228 * (fVar209 + fVar209))),auVar75,
                                       auVar75);
            auVar75 = vfmadd213ss_fma(auVar76,ZEXT416((uint)(fVar228 + fVar228)),
                                      ZEXT416((uint)(fVar228 * fVar228 * 3.0)));
            auVar76 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar72,
                                      SUB6416(ZEXT464(0x40000000),0));
            auVar73 = vfmadd231ss_fma(ZEXT416((uint)(fVar209 * fVar209 * -3.0)),
                                      ZEXT416((uint)(fVar209 + fVar209)),auVar76);
            auVar76 = vfmadd213ss_fma(ZEXT416((uint)local_760._0_4_),auVar72,
                                      ZEXT416((uint)local_740._0_4_));
            fVar209 = auVar77._0_4_ * 0.5;
            fVar210 = auVar75._0_4_ * 0.5;
            fVar211 = auVar73._0_4_ * 0.5;
            fVar212 = auVar76._0_4_ * 0.5;
            auVar204._0_4_ = fVar212 * (float)local_700._0_4_;
            auVar204._4_4_ = fVar212 * (float)local_700._4_4_;
            auVar204._8_4_ = fVar212 * fStack_6f8;
            auVar204._12_4_ = fVar212 * fStack_6f4;
            auVar182._4_4_ = fVar211;
            auVar182._0_4_ = fVar211;
            auVar182._8_4_ = fVar211;
            auVar182._12_4_ = fVar211;
            auVar75 = vfmadd132ps_fma(auVar182,auVar204,local_6c0._0_16_);
            auVar161._4_4_ = fVar210;
            auVar161._0_4_ = fVar210;
            auVar161._8_4_ = fVar210;
            auVar161._12_4_ = fVar210;
            auVar75 = vfmadd132ps_fma(auVar161,auVar75,local_6e0._0_16_);
            auVar249._4_4_ = fVar209;
            auVar249._0_4_ = fVar209;
            auVar249._8_4_ = fVar209;
            auVar249._12_4_ = fVar209;
            local_7c0._0_16_ = vfmadd132ps_fma(auVar249,auVar75,local_6a0._0_16_);
            local_740._0_16_ = vdpps_avx(local_7c0._0_16_,local_7c0._0_16_,0x7f);
            auVar58._12_4_ = 0;
            auVar58._0_12_ = ZEXT812(0);
            fVar209 = local_740._0_4_;
            auVar75 = vrsqrt14ss_avx512f(auVar58 << 0x20,ZEXT416((uint)fVar209));
            fVar210 = auVar75._0_4_;
            local_760._0_16_ = vrcp14ss_avx512f(auVar58 << 0x20,ZEXT416((uint)fVar209));
            auVar21._8_4_ = 0x80000000;
            auVar21._0_8_ = 0x8000000080000000;
            auVar21._12_4_ = 0x80000000;
            auVar76 = vxorps_avx512vl(local_740._0_16_,auVar21);
            auVar75 = vfnmadd213ss_fma(local_760._0_16_,local_740._0_16_,
                                       SUB6416(ZEXT464(0x40000000),0));
            local_7e0._0_4_ = auVar74._0_4_;
            if (fVar209 < auVar76._0_4_) {
              fVar211 = sqrtf(fVar209);
              auVar74 = ZEXT416((uint)local_7e0._0_4_);
              uVar70 = extraout_RAX_03;
              auVar76 = local_7c0._0_16_;
            }
            else {
              auVar76 = vsqrtss_avx(local_740._0_16_,local_740._0_16_);
              fVar211 = auVar76._0_4_;
              auVar76 = local_7c0._0_16_;
            }
            fVar209 = fVar210 * 1.5 + fVar209 * -0.5 * fVar210 * fVar210 * fVar210;
            auVar145._0_4_ = auVar76._0_4_ * fVar209;
            auVar145._4_4_ = auVar76._4_4_ * fVar209;
            auVar145._8_4_ = auVar76._8_4_ * fVar209;
            auVar145._12_4_ = auVar76._12_4_ * fVar209;
            auVar73 = vdpps_avx(auVar1,auVar145,0x7f);
            fVar213 = auVar74._0_4_;
            fVar210 = auVar73._0_4_;
            auVar146._0_4_ = fVar210 * fVar210;
            auVar146._4_4_ = auVar73._4_4_ * auVar73._4_4_;
            auVar146._8_4_ = auVar73._8_4_ * auVar73._8_4_;
            auVar146._12_4_ = auVar73._12_4_ * auVar73._12_4_;
            auVar77 = vsubps_avx512vl(local_800._0_16_,auVar146);
            fVar212 = auVar77._0_4_;
            auVar162._4_12_ = ZEXT812(0) << 0x20;
            auVar162._0_4_ = fVar212;
            auVar78 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar162);
            auVar79 = vmulss_avx512f(auVar77,ZEXT416(0xbf000000));
            if (fVar212 < 0.0) {
              local_630 = fVar209;
              fStack_62c = fVar209;
              fStack_628 = fVar209;
              fStack_624 = fVar209;
              local_620 = auVar78;
              fVar212 = sqrtf(fVar212);
              auVar79 = ZEXT416(auVar79._0_4_);
              auVar74 = ZEXT416((uint)local_7e0._0_4_);
              uVar70 = extraout_RAX_04;
              auVar77 = local_620;
              auVar76 = local_7c0._0_16_;
              fVar209 = local_630;
              fVar192 = fStack_62c;
              fVar228 = fStack_628;
              fVar229 = fStack_624;
            }
            else {
              auVar77 = vsqrtss_avx(auVar77,auVar77);
              fVar212 = auVar77._0_4_;
              auVar77 = auVar78;
              fVar192 = fVar209;
              fVar228 = fVar209;
              fVar229 = fVar209;
            }
            auVar244 = ZEXT1664(auVar1);
            auVar254 = ZEXT3264(local_820);
            auVar255 = ZEXT3264(local_840);
            auVar256 = ZEXT3264(local_860);
            auVar257 = ZEXT3264(local_880);
            auVar163._0_4_ = (float)local_600._0_4_ * (float)local_700._0_4_;
            auVar163._4_4_ = (float)local_600._0_4_ * (float)local_700._4_4_;
            auVar163._8_4_ = (float)local_600._0_4_ * fStack_6f8;
            auVar163._12_4_ = (float)local_600._0_4_ * fStack_6f4;
            auVar183._4_4_ = local_5e0._0_4_;
            auVar183._0_4_ = local_5e0._0_4_;
            auVar183._8_4_ = local_5e0._0_4_;
            auVar183._12_4_ = local_5e0._0_4_;
            auVar11 = vfmadd132ps_fma(auVar183,auVar163,local_6c0._0_16_);
            auVar164._4_4_ = local_5c0._0_4_;
            auVar164._0_4_ = local_5c0._0_4_;
            auVar164._8_4_ = local_5c0._0_4_;
            auVar164._12_4_ = local_5c0._0_4_;
            auVar11 = vfmadd132ps_fma(auVar164,auVar11,local_6e0._0_16_);
            auVar72 = vfmadd213ss_fma(auVar72,SUB6416(ZEXT464(0xc0400000),0),ZEXT416(0x40000000));
            uVar155 = auVar72._0_4_;
            auVar184._4_4_ = uVar155;
            auVar184._0_4_ = uVar155;
            auVar184._8_4_ = uVar155;
            auVar184._12_4_ = uVar155;
            auVar72 = vfmadd132ps_fma(auVar184,auVar11,local_6a0._0_16_);
            auVar165._0_4_ = auVar72._0_4_ * (float)local_740._0_4_;
            auVar165._4_4_ = auVar72._4_4_ * (float)local_740._0_4_;
            auVar165._8_4_ = auVar72._8_4_ * (float)local_740._0_4_;
            auVar165._12_4_ = auVar72._12_4_ * (float)local_740._0_4_;
            auVar72 = vdpps_avx(auVar76,auVar72,0x7f);
            fVar172 = auVar72._0_4_;
            auVar185._0_4_ = auVar76._0_4_ * fVar172;
            auVar185._4_4_ = auVar76._4_4_ * fVar172;
            auVar185._8_4_ = auVar76._8_4_ * fVar172;
            auVar185._12_4_ = auVar76._12_4_ * fVar172;
            auVar72 = vsubps_avx(auVar165,auVar185);
            fVar172 = auVar75._0_4_ * (float)local_760._0_4_;
            auVar11 = vmaxss_avx(ZEXT416((uint)fVar193),
                                 ZEXT416((uint)(local_680._0_4_ * fVar214 * 1.9073486e-06)));
            auVar22._8_4_ = 0x80000000;
            auVar22._0_8_ = 0x8000000080000000;
            auVar22._12_4_ = 0x80000000;
            auVar129._16_16_ = local_880._16_16_;
            auVar80 = vxorps_avx512vl(auVar76,auVar22);
            auVar186._0_4_ = fVar209 * auVar72._0_4_ * fVar172;
            auVar186._4_4_ = fVar192 * auVar72._4_4_ * fVar172;
            auVar186._8_4_ = fVar228 * auVar72._8_4_ * fVar172;
            auVar186._12_4_ = fVar229 * auVar72._12_4_ * fVar172;
            auVar246 = ZEXT1664(auVar145);
            auVar75 = vdpps_avx(auVar80,auVar145,0x7f);
            auVar72 = vfmadd213ss_fma(auVar74,ZEXT416((uint)fVar193),auVar11);
            auVar74 = vdpps_avx(auVar1,auVar186,0x7f);
            auVar220 = vfmadd213ss_fma(ZEXT416((uint)(fVar213 + 1.0)),
                                       ZEXT416((uint)(fVar193 / fVar211)),auVar72);
            fVar209 = auVar75._0_4_ + auVar74._0_4_;
            auVar74 = vdpps_avx(local_710,auVar145,0x7f);
            auVar75 = vdpps_avx(auVar1,auVar80,0x7f);
            auVar72 = vmulss_avx512f(auVar79,auVar77);
            fVar211 = auVar78._0_4_ * 1.5 + auVar72._0_4_ * auVar77._0_4_ * auVar77._0_4_;
            auVar72 = vdpps_avx(auVar1,local_710,0x7f);
            auVar78 = vfnmadd231ss_fma(auVar75,auVar73,ZEXT416((uint)fVar209));
            auVar72 = vfnmadd231ss_fma(auVar72,auVar73,auVar74);
            auVar75 = vpermilps_avx(_local_5a0,0xff);
            fVar212 = fVar212 - auVar75._0_4_;
            auVar77 = vshufps_avx(auVar76,auVar76,0xff);
            auVar75 = vfmsub213ss_fma(auVar78,ZEXT416((uint)fVar211),auVar77);
            auVar238._8_4_ = 0x80000000;
            auVar238._0_8_ = 0x8000000080000000;
            auVar238._12_4_ = 0x80000000;
            auVar240 = ZEXT1664(auVar238);
            auVar233._0_8_ = auVar75._0_8_ ^ 0x8000000080000000;
            auVar233._8_4_ = auVar75._8_4_ ^ 0x80000000;
            auVar233._12_4_ = auVar75._12_4_ ^ 0x80000000;
            auVar235 = ZEXT1664(auVar233);
            auVar72 = ZEXT416((uint)(auVar72._0_4_ * fVar211));
            auVar78 = vfmsub231ss_fma(ZEXT416((uint)(auVar74._0_4_ * auVar75._0_4_)),
                                      ZEXT416((uint)fVar209),auVar72);
            auVar75 = vinsertps_avx(auVar233,auVar72,0x1c);
            auVar222._0_8_ = auVar74._0_8_ ^ 0x8000000080000000;
            auVar222._8_4_ = auVar74._8_4_ ^ 0x80000000;
            auVar222._12_4_ = auVar74._12_4_ ^ 0x80000000;
            auVar72 = vinsertps_avx(ZEXT416((uint)fVar209),auVar222,0x10);
            auVar205._0_4_ = auVar78._0_4_;
            auVar205._4_4_ = auVar205._0_4_;
            auVar205._8_4_ = auVar205._0_4_;
            auVar205._12_4_ = auVar205._0_4_;
            auVar74 = vdivps_avx(auVar75,auVar205);
            auVar75 = vdivps_avx(auVar72,auVar205);
            auVar206._0_4_ = fVar210 * auVar74._0_4_ + fVar212 * auVar75._0_4_;
            auVar206._4_4_ = fVar210 * auVar74._4_4_ + fVar212 * auVar75._4_4_;
            auVar206._8_4_ = fVar210 * auVar74._8_4_ + fVar212 * auVar75._8_4_;
            auVar206._12_4_ = fVar210 * auVar74._12_4_ + fVar212 * auVar75._12_4_;
            auVar74 = vsubps_avx(local_680._0_16_,auVar206);
            auVar23._8_4_ = 0x7fffffff;
            auVar23._0_8_ = 0x7fffffff7fffffff;
            auVar23._12_4_ = 0x7fffffff;
            auVar75 = vandps_avx512vl(auVar73,auVar23);
            if (auVar75._0_4_ < auVar220._0_4_) {
              auVar75 = vfmadd231ss_fma(ZEXT416((uint)(auVar220._0_4_ + auVar11._0_4_)),local_640,
                                        ZEXT416(0x36000000));
              auVar24._8_4_ = 0x7fffffff;
              auVar24._0_8_ = 0x7fffffff7fffffff;
              auVar24._12_4_ = 0x7fffffff;
              auVar72 = vandps_avx512vl(ZEXT416((uint)fVar212),auVar24);
              if (auVar72._0_4_ < auVar75._0_4_) {
                bVar69 = uVar68 < 5;
                fVar214 = auVar74._0_4_ + (float)local_650._0_4_;
                if ((fVar138 <= fVar214) &&
                   (fVar193 = *(float *)(ray + k * 4 + 0x80), fVar214 <= fVar193)) {
                  auVar75 = vmovshdup_avx(auVar74);
                  bVar63 = 0;
                  if ((auVar75._0_4_ < 0.0) || (1.0 < auVar75._0_4_)) goto LAB_01a420c6;
                  auVar207._0_12_ = ZEXT812(0);
                  auVar207._12_4_ = 0;
                  auVar129._0_16_ = auVar207;
                  auVar128._4_28_ = auVar129._4_28_;
                  auVar128._0_4_ = local_800._0_4_;
                  auVar75 = vrsqrt14ss_avx512f(auVar207,auVar128._0_16_);
                  fVar209 = auVar75._0_4_;
                  auVar75 = vmulss_avx512f(local_800._0_16_,ZEXT416(0xbf000000));
                  pGVar2 = (context->scene->geometries).items[local_8b8].ptr;
                  if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar63 = 1, pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_01a420c6;
                    fVar209 = fVar209 * 1.5 + auVar75._0_4_ * fVar209 * fVar209 * fVar209;
                    auVar187._0_4_ = auVar1._0_4_ * fVar209;
                    auVar187._4_4_ = auVar1._4_4_ * fVar209;
                    auVar187._8_4_ = auVar1._8_4_ * fVar209;
                    auVar187._12_4_ = auVar1._12_4_ * fVar209;
                    auVar73 = vfmadd213ps_fma(auVar77,auVar187,auVar76);
                    auVar75 = vshufps_avx(auVar187,auVar187,0xc9);
                    auVar72 = vshufps_avx(auVar76,auVar76,0xc9);
                    auVar188._0_4_ = auVar187._0_4_ * auVar72._0_4_;
                    auVar188._4_4_ = auVar187._4_4_ * auVar72._4_4_;
                    auVar188._8_4_ = auVar187._8_4_ * auVar72._8_4_;
                    auVar188._12_4_ = auVar187._12_4_ * auVar72._12_4_;
                    auVar76 = vfmsub231ps_fma(auVar188,auVar76,auVar75);
                    auVar75 = vshufps_avx(auVar76,auVar76,0xc9);
                    auVar72 = vshufps_avx(auVar73,auVar73,0xc9);
                    auVar76 = vshufps_avx(auVar76,auVar76,0xd2);
                    auVar147._0_4_ = auVar73._0_4_ * auVar76._0_4_;
                    auVar147._4_4_ = auVar73._4_4_ * auVar76._4_4_;
                    auVar147._8_4_ = auVar73._8_4_ * auVar76._8_4_;
                    auVar147._12_4_ = auVar73._12_4_ * auVar76._12_4_;
                    auVar75 = vfmsub231ps_fma(auVar147,auVar75,auVar72);
                    local_510 = vshufps_avx(auVar74,auVar74,0x55);
                    local_540 = (RTCHitN  [16])vshufps_avx(auVar75,auVar75,0x55);
                    auStack_530 = vshufps_avx(auVar75,auVar75,0xaa);
                    local_520 = auVar75._0_4_;
                    uStack_51c = local_520;
                    uStack_518 = local_520;
                    uStack_514 = local_520;
                    local_500 = ZEXT416(0) << 0x20;
                    local_4f0 = local_550._0_8_;
                    uStack_4e8 = local_550._8_8_;
                    local_4e0 = local_560;
                    vpcmpeqd_avx2(ZEXT1632(local_560),ZEXT1632(local_560));
                    uStack_4cc = context->user->instID[0];
                    local_4d0 = uStack_4cc;
                    uStack_4c8 = uStack_4cc;
                    uStack_4c4 = uStack_4cc;
                    uStack_4c0 = context->user->instPrimID[0];
                    uStack_4bc = uStack_4c0;
                    uStack_4b8 = uStack_4c0;
                    uStack_4b4 = uStack_4c0;
                    *(float *)(ray + k * 4 + 0x80) = fVar214;
                    local_8d0 = local_570;
                    local_790.valid = (int *)local_8d0;
                    local_790.geometryUserPtr = pGVar2->userPtr;
                    local_790.context = context->user;
                    local_790.hit = local_540;
                    local_790.N = 4;
                    local_790.ray = (RTCRayN *)ray;
                    if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar235 = ZEXT1664(auVar233);
                      auVar240 = ZEXT1664(auVar238);
                      auVar244 = ZEXT1664(auVar1);
                      auVar246 = ZEXT1664(auVar145);
                      (*pGVar2->occlusionFilterN)(&local_790);
                      auVar257 = ZEXT3264(local_880);
                      auVar256 = ZEXT3264(local_860);
                      auVar255 = ZEXT3264(local_840);
                      auVar254 = ZEXT3264(local_820);
                    }
                    uVar70 = vptestmd_avx512vl(local_8d0,local_8d0);
                    if ((uVar70 & 0xf) != 0) {
                      p_Var3 = context->args->filter;
                      if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar235 = ZEXT1664(auVar235._0_16_);
                        auVar240 = ZEXT1664(auVar240._0_16_);
                        auVar244 = ZEXT1664(auVar244._0_16_);
                        auVar246 = ZEXT1664(auVar246._0_16_);
                        (*p_Var3)(&local_790);
                        auVar257 = ZEXT3264(local_880);
                        auVar256 = ZEXT3264(local_860);
                        auVar255 = ZEXT3264(local_840);
                        auVar254 = ZEXT3264(local_820);
                      }
                      uVar70 = vptestmd_avx512vl(local_8d0,local_8d0);
                      uVar70 = uVar70 & 0xf;
                      auVar74 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      bVar4 = (bool)((byte)uVar70 & 1);
                      bVar5 = (bool)((byte)(uVar70 >> 1) & 1);
                      bVar6 = (bool)((byte)(uVar70 >> 2) & 1);
                      bVar7 = SUB81(uVar70 >> 3,0);
                      *(uint *)(local_790.ray + 0x80) =
                           (uint)bVar4 * auVar74._0_4_ |
                           (uint)!bVar4 * *(int *)(local_790.ray + 0x80);
                      *(uint *)(local_790.ray + 0x84) =
                           (uint)bVar5 * auVar74._4_4_ |
                           (uint)!bVar5 * *(int *)(local_790.ray + 0x84);
                      *(uint *)(local_790.ray + 0x88) =
                           (uint)bVar6 * auVar74._8_4_ |
                           (uint)!bVar6 * *(int *)(local_790.ray + 0x88);
                      *(uint *)(local_790.ray + 0x8c) =
                           (uint)bVar7 * auVar74._12_4_ |
                           (uint)!bVar7 * *(int *)(local_790.ray + 0x8c);
                      bVar63 = 1;
                      if ((byte)uVar70 != 0) goto LAB_01a420c6;
                    }
                    *(float *)(ray + k * 4 + 0x80) = fVar193;
                  }
                }
                bVar63 = 0;
                goto LAB_01a420c6;
              }
            }
            uVar68 = uVar68 + 1;
          }
          bVar69 = false;
LAB_01a420c6:
          bVar64 = bVar64 | bVar69 & bVar63;
          uVar155 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar224._4_4_ = uVar155;
          auVar224._0_4_ = uVar155;
          auVar224._8_4_ = uVar155;
          auVar224._12_4_ = uVar155;
          auVar224._16_4_ = uVar155;
          auVar224._20_4_ = uVar155;
          auVar224._24_4_ = uVar155;
          auVar224._28_4_ = uVar155;
          auVar225 = ZEXT3264(auVar224);
          auVar60._4_4_ = fStack_3fc;
          auVar60._0_4_ = local_400;
          auVar60._8_4_ = fStack_3f8;
          auVar60._12_4_ = fStack_3f4;
          auVar60._16_4_ = fStack_3f0;
          auVar60._20_4_ = fStack_3ec;
          auVar60._24_4_ = fStack_3e8;
          auVar60._28_4_ = fStack_3e4;
          uVar12 = vcmpps_avx512vl(auVar224,auVar60,0xd);
        }
        uVar14 = vpcmpd_avx512vl(local_3c0,local_360,1);
        uVar13 = vpcmpd_avx512vl(local_3c0,_local_420,1);
        auVar169._0_4_ = (float)local_440._0_4_ + (float)local_1c0._0_4_;
        auVar169._4_4_ = (float)local_440._4_4_ + (float)local_1c0._4_4_;
        auVar169._8_4_ = fStack_438 + fStack_1b8;
        auVar169._12_4_ = fStack_434 + fStack_1b4;
        auVar169._16_4_ = fStack_430 + fStack_1b0;
        auVar169._20_4_ = fStack_42c + fStack_1ac;
        auVar169._24_4_ = fStack_428 + fStack_1a8;
        auVar169._28_4_ = fStack_424 + fStack_1a4;
        uVar155 = auVar225._0_4_;
        auVar190._4_4_ = uVar155;
        auVar190._0_4_ = uVar155;
        auVar190._8_4_ = uVar155;
        auVar190._12_4_ = uVar155;
        auVar190._16_4_ = uVar155;
        auVar190._20_4_ = uVar155;
        auVar190._24_4_ = uVar155;
        auVar190._28_4_ = uVar155;
        uVar12 = vcmpps_avx512vl(auVar169,auVar190,2);
        bVar67 = (byte)local_8ac & (byte)uVar14 & (byte)uVar12;
        auVar208._0_4_ = (float)local_440._0_4_ + (float)local_3a0._0_4_;
        auVar208._4_4_ = (float)local_440._4_4_ + (float)local_3a0._4_4_;
        auVar208._8_4_ = fStack_438 + fStack_398;
        auVar208._12_4_ = fStack_434 + fStack_394;
        auVar208._16_4_ = fStack_430 + fStack_390;
        auVar208._20_4_ = fStack_42c + fStack_38c;
        auVar208._24_4_ = fStack_428 + fStack_388;
        auVar208._28_4_ = fStack_424 + fStack_384;
        uVar12 = vcmpps_avx512vl(auVar208,auVar190,2);
        bVar62 = bVar62 & (byte)uVar13 & (byte)uVar12 | bVar67;
        if (bVar62 != 0) {
          abStack_180[uVar66 * 0x60] = bVar62;
          bVar69 = (bool)(bVar67 >> 1 & 1);
          bVar4 = (bool)(bVar67 >> 2 & 1);
          bVar5 = (bool)(bVar67 >> 3 & 1);
          bVar6 = (bool)(bVar67 >> 4 & 1);
          bVar7 = (bool)(bVar67 >> 5 & 1);
          bVar8 = (bool)(bVar67 >> 6 & 1);
          auStack_160[uVar66 * 0x18] =
               (uint)(bVar67 & 1) * local_1c0._0_4_ | (uint)!(bool)(bVar67 & 1) * local_3a0._0_4_;
          auStack_160[uVar66 * 0x18 + 1] =
               (uint)bVar69 * local_1c0._4_4_ | (uint)!bVar69 * local_3a0._4_4_;
          auStack_160[uVar66 * 0x18 + 2] =
               (uint)bVar4 * (int)fStack_1b8 | (uint)!bVar4 * (int)fStack_398;
          auStack_160[uVar66 * 0x18 + 3] =
               (uint)bVar5 * (int)fStack_1b4 | (uint)!bVar5 * (int)fStack_394;
          auStack_160[uVar66 * 0x18 + 4] =
               (uint)bVar6 * (int)fStack_1b0 | (uint)!bVar6 * (int)fStack_390;
          auStack_160[uVar66 * 0x18 + 5] =
               (uint)bVar7 * (int)fStack_1ac | (uint)!bVar7 * (int)fStack_38c;
          auStack_160[uVar66 * 0x18 + 6] =
               (uint)bVar8 * (int)fStack_1a8 | (uint)!bVar8 * (int)fStack_388;
          auStack_160[uVar66 * 0x18 + 7] =
               (uint)(bVar67 >> 7) * (int)fStack_1a4 | (uint)!(bool)(bVar67 >> 7) * (int)fStack_384;
          uVar70 = vmovlps_avx(local_3d0);
          (&uStack_140)[uVar66 * 0xc] = uVar70;
          aiStack_138[uVar66 * 0x18] = local_a2c + 1;
          uVar66 = (ulong)((int)uVar66 + 1);
        }
        auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        prim = local_7a0;
      }
      auVar258 = ZEXT3264(auVar90);
      auVar225 = ZEXT3264(_DAT_01f7b040);
    }
    do {
      uVar71 = (uint)uVar66;
      uVar66 = (ulong)(uVar71 - 1);
      if (uVar71 == 0) {
        if (bVar64 != 0) goto LAB_01a4269f;
        uVar155 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar32._4_4_ = uVar155;
        auVar32._0_4_ = uVar155;
        auVar32._8_4_ = uVar155;
        auVar32._12_4_ = uVar155;
        auVar32._16_4_ = uVar155;
        auVar32._20_4_ = uVar155;
        auVar32._24_4_ = uVar155;
        auVar32._28_4_ = uVar155;
        uVar12 = vcmpps_avx512vl(local_340,auVar32,2);
        local_798 = (ulong)((uint)local_608 & (uint)uVar12);
        goto LAB_01a3fce1;
      }
      auVar90 = *(undefined1 (*) [32])(auStack_160 + uVar66 * 0x18);
      auVar170._0_4_ = auVar90._0_4_ + (float)local_440._0_4_;
      auVar170._4_4_ = auVar90._4_4_ + (float)local_440._4_4_;
      auVar170._8_4_ = auVar90._8_4_ + fStack_438;
      auVar170._12_4_ = auVar90._12_4_ + fStack_434;
      auVar170._16_4_ = auVar90._16_4_ + fStack_430;
      auVar170._20_4_ = auVar90._20_4_ + fStack_42c;
      auVar170._24_4_ = auVar90._24_4_ + fStack_428;
      auVar170._28_4_ = auVar90._28_4_ + fStack_424;
      uVar155 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar31._4_4_ = uVar155;
      auVar31._0_4_ = uVar155;
      auVar31._8_4_ = uVar155;
      auVar31._12_4_ = uVar155;
      auVar31._16_4_ = uVar155;
      auVar31._20_4_ = uVar155;
      auVar31._24_4_ = uVar155;
      auVar31._28_4_ = uVar155;
      uVar12 = vcmpps_avx512vl(auVar170,auVar31,2);
      uVar131 = (uint)uVar12 & (uint)abStack_180[uVar66 * 0x60];
    } while (uVar131 == 0);
    uVar70 = (&uStack_140)[uVar66 * 0xc];
    auVar166._8_8_ = 0;
    auVar166._0_8_ = uVar70;
    auVar191._8_4_ = 0x7f800000;
    auVar191._0_8_ = 0x7f8000007f800000;
    auVar191._12_4_ = 0x7f800000;
    auVar191._16_4_ = 0x7f800000;
    auVar191._20_4_ = 0x7f800000;
    auVar191._24_4_ = 0x7f800000;
    auVar191._28_4_ = 0x7f800000;
    auVar91 = vblendmps_avx512vl(auVar191,auVar90);
    bVar62 = (byte)uVar131;
    auVar130._0_4_ =
         (uint)(bVar62 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar62 & 1) * (int)auVar90._0_4_;
    bVar69 = (bool)((byte)(uVar131 >> 1) & 1);
    auVar130._4_4_ = (uint)bVar69 * auVar91._4_4_ | (uint)!bVar69 * (int)auVar90._4_4_;
    bVar69 = (bool)((byte)(uVar131 >> 2) & 1);
    auVar130._8_4_ = (uint)bVar69 * auVar91._8_4_ | (uint)!bVar69 * (int)auVar90._8_4_;
    bVar69 = (bool)((byte)(uVar131 >> 3) & 1);
    auVar130._12_4_ = (uint)bVar69 * auVar91._12_4_ | (uint)!bVar69 * (int)auVar90._12_4_;
    bVar69 = (bool)((byte)(uVar131 >> 4) & 1);
    auVar130._16_4_ = (uint)bVar69 * auVar91._16_4_ | (uint)!bVar69 * (int)auVar90._16_4_;
    bVar69 = (bool)((byte)(uVar131 >> 5) & 1);
    auVar130._20_4_ = (uint)bVar69 * auVar91._20_4_ | (uint)!bVar69 * (int)auVar90._20_4_;
    bVar69 = (bool)((byte)(uVar131 >> 6) & 1);
    auVar130._24_4_ = (uint)bVar69 * auVar91._24_4_ | (uint)!bVar69 * (int)auVar90._24_4_;
    auVar130._28_4_ =
         (uVar131 >> 7) * auVar91._28_4_ | (uint)!SUB41(uVar131 >> 7,0) * (int)auVar90._28_4_;
    auVar90 = vshufps_avx(auVar130,auVar130,0xb1);
    auVar90 = vminps_avx(auVar130,auVar90);
    auVar91 = vshufpd_avx(auVar90,auVar90,5);
    auVar90 = vminps_avx(auVar90,auVar91);
    auVar91 = vpermpd_avx2(auVar90,0x4e);
    auVar90 = vminps_avx(auVar90,auVar91);
    uVar12 = vcmpps_avx512vl(auVar130,auVar90,0);
    bVar67 = (byte)uVar12 & bVar62;
    if (bVar67 != 0) {
      uVar131 = (uint)bVar67;
    }
    uVar132 = 0;
    for (; (uVar131 & 1) == 0; uVar131 = uVar131 >> 1 | 0x80000000) {
      uVar132 = uVar132 + 1;
    }
    local_a2c = aiStack_138[uVar66 * 0x18];
    bVar62 = ~('\x01' << ((byte)uVar132 & 0x1f)) & bVar62;
    abStack_180[uVar66 * 0x60] = bVar62;
    if (bVar62 == 0) {
      uVar71 = uVar71 - 1;
    }
    uVar155 = (undefined4)uVar70;
    auVar154._4_4_ = uVar155;
    auVar154._0_4_ = uVar155;
    auVar154._8_4_ = uVar155;
    auVar154._12_4_ = uVar155;
    auVar154._16_4_ = uVar155;
    auVar154._20_4_ = uVar155;
    auVar154._24_4_ = uVar155;
    auVar154._28_4_ = uVar155;
    auVar74 = vmovshdup_avx(auVar166);
    auVar74 = vsubps_avx(auVar74,auVar166);
    auVar171._0_4_ = auVar74._0_4_;
    auVar171._4_4_ = auVar171._0_4_;
    auVar171._8_4_ = auVar171._0_4_;
    auVar171._12_4_ = auVar171._0_4_;
    auVar171._16_4_ = auVar171._0_4_;
    auVar171._20_4_ = auVar171._0_4_;
    auVar171._24_4_ = auVar171._0_4_;
    auVar171._28_4_ = auVar171._0_4_;
    auVar74 = vfmadd132ps_fma(auVar171,auVar154,auVar225._0_32_);
    _local_540 = ZEXT1632(auVar74);
    local_3d0._8_8_ = 0;
    local_3d0._0_8_ = *(ulong *)(local_540 + (ulong)uVar132 * 4);
    uVar66 = (ulong)uVar71;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }